

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  long lVar75;
  Geometry *pGVar76;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar86;
  undefined1 auVar91 [16];
  int iVar77;
  ulong uVar78;
  Primitive *pPVar79;
  uint uVar80;
  ulong uVar81;
  uint uVar82;
  byte bVar83;
  ulong uVar84;
  float fVar85;
  float fVar135;
  float fVar136;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar89 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar90 [16];
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar92 [16];
  float fVar138;
  float fVar141;
  float fVar142;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar143;
  undefined4 uVar144;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined8 uVar156;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar174;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar175;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [64];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_544;
  Geometry *local_540;
  ulong local_538;
  RayHit *local_530;
  RayQueryContext *local_528;
  Primitive *local_520;
  Precalculations *local_518;
  Primitive *local_510;
  RTCFilterFunctionNArguments local_508;
  uint local_4d8;
  int local_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined4 local_488;
  float local_484;
  undefined4 local_480;
  uint local_47c;
  undefined4 local_478;
  uint local_474;
  uint local_470;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  int local_23c;
  undefined1 local_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar72 = (ulong)(byte)PVar12;
  lVar21 = uVar72 * 0x19;
  fVar162 = *(float *)(prim + lVar21 + 0x12);
  auVar157 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar21 + 6));
  fVar175 = fVar162 * auVar157._0_4_;
  fVar143 = fVar162 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar88);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar108 = vpmovsxbd_avx2(auVar91);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar107 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar101 = vpmovsxbd_avx2(auVar7);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar99 = vcvtdq2ps_avx(auVar101);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar72 + 6);
  auVar97 = vpmovsxbd_avx2(auVar8);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar81 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar100 = vpmovsxbd_avx2(auVar9);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar81 + uVar72 + 6);
  auVar106 = vpmovsxbd_avx2(auVar10);
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar84 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar95 = vpmovsxbd_avx2(auVar11);
  auVar102 = vcvtdq2ps_avx(auVar95);
  auVar206._4_4_ = fVar143;
  auVar206._0_4_ = fVar143;
  auVar206._8_4_ = fVar143;
  auVar206._12_4_ = fVar143;
  auVar206._16_4_ = fVar143;
  auVar206._20_4_ = fVar143;
  auVar206._24_4_ = fVar143;
  auVar206._28_4_ = fVar143;
  auVar208._8_4_ = 1;
  auVar208._0_8_ = 0x100000001;
  auVar208._12_4_ = 1;
  auVar208._16_4_ = 1;
  auVar208._20_4_ = 1;
  auVar208._24_4_ = 1;
  auVar208._28_4_ = 1;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar212 = ZEXT3264(auVar93);
  auVar104 = ZEXT1632(CONCAT412(fVar162 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar162 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar162 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar143))));
  auVar103 = vpermps_avx2(auVar208,auVar104);
  auVar94 = vpermps_avx512vl(auVar93,auVar104);
  fVar143 = auVar94._0_4_;
  fVar153 = auVar94._4_4_;
  auVar104._4_4_ = fVar153 * auVar108._4_4_;
  auVar104._0_4_ = fVar143 * auVar108._0_4_;
  fVar154 = auVar94._8_4_;
  auVar104._8_4_ = fVar154 * auVar108._8_4_;
  fVar155 = auVar94._12_4_;
  auVar104._12_4_ = fVar155 * auVar108._12_4_;
  fVar174 = auVar94._16_4_;
  auVar104._16_4_ = fVar174 * auVar108._16_4_;
  fVar85 = auVar94._20_4_;
  auVar104._20_4_ = fVar85 * auVar108._20_4_;
  fVar86 = auVar94._24_4_;
  auVar104._24_4_ = fVar86 * auVar108._24_4_;
  auVar104._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar97._4_4_ * fVar153;
  auVar101._0_4_ = auVar97._0_4_ * fVar143;
  auVar101._8_4_ = auVar97._8_4_ * fVar154;
  auVar101._12_4_ = auVar97._12_4_ * fVar155;
  auVar101._16_4_ = auVar97._16_4_ * fVar174;
  auVar101._20_4_ = auVar97._20_4_ * fVar85;
  auVar101._24_4_ = auVar97._24_4_ * fVar86;
  auVar101._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar102._4_4_ * fVar153;
  auVar95._0_4_ = auVar102._0_4_ * fVar143;
  auVar95._8_4_ = auVar102._8_4_ * fVar154;
  auVar95._12_4_ = auVar102._12_4_ * fVar155;
  auVar95._16_4_ = auVar102._16_4_ * fVar174;
  auVar95._20_4_ = auVar102._20_4_ * fVar85;
  auVar95._24_4_ = auVar102._24_4_ * fVar86;
  auVar95._28_4_ = auVar94._28_4_;
  auVar87 = vfmadd231ps_fma(auVar104,auVar103,auVar96);
  auVar88 = vfmadd231ps_fma(auVar101,auVar103,auVar99);
  auVar91 = vfmadd231ps_fma(auVar95,auVar106,auVar103);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar206,auVar98);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar206,auVar107);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar100,auVar206);
  auVar207._4_4_ = fVar175;
  auVar207._0_4_ = fVar175;
  auVar207._8_4_ = fVar175;
  auVar207._12_4_ = fVar175;
  auVar207._16_4_ = fVar175;
  auVar207._20_4_ = fVar175;
  auVar207._24_4_ = fVar175;
  auVar207._28_4_ = fVar175;
  auVar95 = ZEXT1632(CONCAT412(fVar162 * auVar157._12_4_,
                               CONCAT48(fVar162 * auVar157._8_4_,
                                        CONCAT44(fVar162 * auVar157._4_4_,fVar175))));
  auVar101 = vpermps_avx2(auVar208,auVar95);
  auVar95 = vpermps_avx512vl(auVar93,auVar95);
  fVar162 = auVar95._0_4_;
  fVar143 = auVar95._4_4_;
  auVar103._4_4_ = fVar143 * auVar108._4_4_;
  auVar103._0_4_ = fVar162 * auVar108._0_4_;
  fVar153 = auVar95._8_4_;
  auVar103._8_4_ = fVar153 * auVar108._8_4_;
  fVar154 = auVar95._12_4_;
  auVar103._12_4_ = fVar154 * auVar108._12_4_;
  fVar155 = auVar95._16_4_;
  auVar103._16_4_ = fVar155 * auVar108._16_4_;
  fVar174 = auVar95._20_4_;
  auVar103._20_4_ = fVar174 * auVar108._20_4_;
  fVar85 = auVar95._24_4_;
  auVar103._24_4_ = fVar85 * auVar108._24_4_;
  auVar103._28_4_ = 1;
  auVar93._4_4_ = auVar97._4_4_ * fVar143;
  auVar93._0_4_ = auVar97._0_4_ * fVar162;
  auVar93._8_4_ = auVar97._8_4_ * fVar153;
  auVar93._12_4_ = auVar97._12_4_ * fVar154;
  auVar93._16_4_ = auVar97._16_4_ * fVar155;
  auVar93._20_4_ = auVar97._20_4_ * fVar174;
  auVar93._24_4_ = auVar97._24_4_ * fVar85;
  auVar93._28_4_ = auVar108._28_4_;
  auVar97._4_4_ = auVar102._4_4_ * fVar143;
  auVar97._0_4_ = auVar102._0_4_ * fVar162;
  auVar97._8_4_ = auVar102._8_4_ * fVar153;
  auVar97._12_4_ = auVar102._12_4_ * fVar154;
  auVar97._16_4_ = auVar102._16_4_ * fVar155;
  auVar97._20_4_ = auVar102._20_4_ * fVar174;
  auVar97._24_4_ = auVar102._24_4_ * fVar85;
  auVar97._28_4_ = auVar95._28_4_;
  auVar6 = vfmadd231ps_fma(auVar103,auVar101,auVar96);
  auVar7 = vfmadd231ps_fma(auVar93,auVar101,auVar99);
  auVar8 = vfmadd231ps_fma(auVar97,auVar101,auVar106);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar207,auVar98);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar207,auVar107);
  auVar195._8_4_ = 0x7fffffff;
  auVar195._0_8_ = 0x7fffffff7fffffff;
  auVar195._12_4_ = 0x7fffffff;
  auVar195._16_4_ = 0x7fffffff;
  auVar195._20_4_ = 0x7fffffff;
  auVar195._24_4_ = 0x7fffffff;
  auVar195._28_4_ = 0x7fffffff;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar207,auVar100);
  auVar98 = vandps_avx(ZEXT1632(auVar87),auVar195);
  auVar193._8_4_ = 0x219392ef;
  auVar193._0_8_ = 0x219392ef219392ef;
  auVar193._12_4_ = 0x219392ef;
  auVar193._16_4_ = 0x219392ef;
  auVar193._20_4_ = 0x219392ef;
  auVar193._24_4_ = 0x219392ef;
  auVar193._28_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar98,auVar193,1);
  bVar14 = (bool)((byte)uVar81 & 1);
  auVar94._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._0_4_;
  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._4_4_;
  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._8_4_;
  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar88),auVar195);
  uVar81 = vcmpps_avx512vl(auVar98,auVar193,1);
  bVar14 = (bool)((byte)uVar81 & 1);
  auVar105._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar88._0_4_;
  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar88._4_4_;
  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar88._8_4_;
  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar88._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar91),auVar195);
  uVar81 = vcmpps_avx512vl(auVar98,auVar193,1);
  bVar14 = (bool)((byte)uVar81 & 1);
  auVar98._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar91._0_4_;
  bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar91._4_4_;
  bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar91._8_4_;
  bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar91._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar194._8_4_ = 0x3f800000;
  auVar194._0_8_ = 0x3f8000003f800000;
  auVar194._12_4_ = 0x3f800000;
  auVar194._16_4_ = 0x3f800000;
  auVar194._20_4_ = 0x3f800000;
  auVar194._24_4_ = 0x3f800000;
  auVar194._28_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar94,auVar96,auVar194);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar105);
  auVar88 = vfnmadd213ps_fma(auVar105,auVar96,auVar194);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar91 = vfnmadd213ps_fma(auVar98,auVar96,auVar194);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar96,auVar96);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar6));
  auVar100._4_4_ = auVar87._4_4_ * auVar98._4_4_;
  auVar100._0_4_ = auVar87._0_4_ * auVar98._0_4_;
  auVar100._8_4_ = auVar87._8_4_ * auVar98._8_4_;
  auVar100._12_4_ = auVar87._12_4_ * auVar98._12_4_;
  auVar100._16_4_ = auVar98._16_4_ * 0.0;
  auVar100._20_4_ = auVar98._20_4_ * 0.0;
  auVar100._24_4_ = auVar98._24_4_ * 0.0;
  auVar100._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar6));
  auVar97 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar171._0_4_ = auVar87._0_4_ * auVar98._0_4_;
  auVar171._4_4_ = auVar87._4_4_ * auVar98._4_4_;
  auVar171._8_4_ = auVar87._8_4_ * auVar98._8_4_;
  auVar171._12_4_ = auVar87._12_4_ * auVar98._12_4_;
  auVar171._16_4_ = auVar98._16_4_ * 0.0;
  auVar171._20_4_ = auVar98._20_4_ * 0.0;
  auVar171._24_4_ = auVar98._24_4_ * 0.0;
  auVar171._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar12 * 0x10 + uVar72 * -2 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar7));
  auVar106._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar106._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar106._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar106._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar106._16_4_ = auVar98._16_4_ * 0.0;
  auVar106._20_4_ = auVar98._20_4_ * 0.0;
  auVar106._24_4_ = auVar98._24_4_ * 0.0;
  auVar106._28_4_ = auVar98._28_4_;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar7));
  auVar160._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar160._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar160._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar160._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar160._16_4_ = auVar98._16_4_ * 0.0;
  auVar160._20_4_ = auVar98._20_4_ * 0.0;
  auVar160._24_4_ = auVar98._24_4_ * 0.0;
  auVar160._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 + uVar72 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar8));
  auVar102._4_4_ = auVar98._4_4_ * auVar91._4_4_;
  auVar102._0_4_ = auVar98._0_4_ * auVar91._0_4_;
  auVar102._8_4_ = auVar98._8_4_ * auVar91._8_4_;
  auVar102._12_4_ = auVar98._12_4_ * auVar91._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar8));
  auVar109._0_4_ = auVar91._0_4_ * auVar98._0_4_;
  auVar109._4_4_ = auVar91._4_4_ * auVar98._4_4_;
  auVar109._8_4_ = auVar91._8_4_ * auVar98._8_4_;
  auVar109._12_4_ = auVar91._12_4_ * auVar98._12_4_;
  auVar109._16_4_ = auVar98._16_4_ * 0.0;
  auVar109._20_4_ = auVar98._20_4_ * 0.0;
  auVar109._24_4_ = auVar98._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar100,auVar171);
  auVar96 = vpminsd_avx2(auVar106,auVar160);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar102,auVar109);
  uVar144 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar108._4_4_ = uVar144;
  auVar108._0_4_ = uVar144;
  auVar108._8_4_ = uVar144;
  auVar108._12_4_ = uVar144;
  auVar108._16_4_ = uVar144;
  auVar108._20_4_ = uVar144;
  auVar108._24_4_ = uVar144;
  auVar108._28_4_ = uVar144;
  auVar96 = vmaxps_avx512vl(auVar96,auVar108);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar100,auVar171);
  auVar96 = vpmaxsd_avx2(auVar106,auVar160);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar102,auVar109);
  fVar162 = (ray->super_RayK<1>).tfar;
  auVar107._4_4_ = fVar162;
  auVar107._0_4_ = fVar162;
  auVar107._8_4_ = fVar162;
  auVar107._12_4_ = fVar162;
  auVar107._16_4_ = fVar162;
  auVar107._20_4_ = fVar162;
  auVar107._24_4_ = fVar162;
  auVar107._28_4_ = fVar162;
  auVar96 = vminps_avx512vl(auVar96,auVar107);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar99);
  uVar20 = vpcmpgtd_avx512vl(auVar97,_DAT_01fe9900);
  uVar156 = vcmpps_avx512vl(local_80,auVar98,2);
  if ((byte)((byte)uVar156 & (byte)uVar20) != 0) {
    uVar81 = (ulong)(byte)((byte)uVar156 & (byte)uVar20);
    pPVar79 = prim + lVar21 + 0x16;
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar213 = ZEXT1664(auVar87);
    auVar214 = ZEXT464(0x35000000);
    local_528 = context;
    local_530 = ray;
    local_510 = prim;
    local_518 = pre;
    local_520 = pPVar79;
    do {
      lVar21 = 0;
      for (uVar72 = uVar81; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar81 = uVar81 - 1 & uVar81;
      uVar80 = *(uint *)(prim + lVar21 * 4 + 6);
      uVar72 = (ulong)(uint)((int)lVar21 << 6);
      uVar82 = *(uint *)(prim + 2);
      local_538 = (ulong)uVar82;
      pGVar76 = (context->scene->geometries).items[uVar82].ptr;
      local_4d0 = *(undefined1 (*) [16])(pPVar79 + uVar72);
      if (uVar81 != 0) {
        uVar78 = uVar81 - 1 & uVar81;
        for (uVar84 = uVar81; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        }
        if (uVar78 != 0) {
          for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_4a0 = *(undefined1 (*) [16])(pPVar79 + uVar72 + 0x10);
      local_4b0 = *(undefined1 (*) [16])(pPVar79 + uVar72 + 0x20);
      _local_4c0 = *(undefined1 (*) [16])(pPVar79 + uVar72 + 0x30);
      iVar77 = (int)pGVar76[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar3 = (ray->super_RayK<1>).org.field_0;
      auVar88 = vsubps_avx(local_4d0,(undefined1  [16])aVar3);
      uVar144 = auVar88._0_4_;
      auVar157._4_4_ = uVar144;
      auVar157._0_4_ = uVar144;
      auVar157._8_4_ = uVar144;
      auVar157._12_4_ = uVar144;
      auVar87 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar162 = (pre->ray_space).vz.field_0.m128[0];
      fVar143 = (pre->ray_space).vz.field_0.m128[1];
      fVar153 = (pre->ray_space).vz.field_0.m128[2];
      fVar154 = (pre->ray_space).vz.field_0.m128[3];
      auVar198._0_4_ = auVar88._0_4_ * fVar162;
      auVar198._4_4_ = auVar88._4_4_ * fVar143;
      auVar198._8_4_ = auVar88._8_4_ * fVar153;
      auVar198._12_4_ = auVar88._12_4_ * fVar154;
      auVar87 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar87);
      auVar91 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar157);
      auVar88 = vsubps_avx(local_4a0,(undefined1  [16])aVar3);
      uVar144 = auVar88._0_4_;
      auVar158._4_4_ = uVar144;
      auVar158._0_4_ = uVar144;
      auVar158._8_4_ = uVar144;
      auVar158._12_4_ = uVar144;
      auVar87 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar90._0_4_ = auVar88._0_4_ * fVar162;
      auVar90._4_4_ = auVar88._4_4_ * fVar143;
      auVar90._8_4_ = auVar88._8_4_ * fVar153;
      auVar90._12_4_ = auVar88._12_4_ * fVar154;
      auVar87 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar5,auVar87);
      auVar6 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar158);
      auVar88 = vsubps_avx512vl(local_4b0,(undefined1  [16])aVar3);
      uVar144 = auVar88._0_4_;
      auVar159._4_4_ = uVar144;
      auVar159._0_4_ = uVar144;
      auVar159._8_4_ = uVar144;
      auVar159._12_4_ = uVar144;
      auVar87 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar202._0_4_ = auVar88._0_4_ * fVar162;
      auVar202._4_4_ = auVar88._4_4_ * fVar143;
      auVar202._8_4_ = auVar88._8_4_ * fVar153;
      auVar202._12_4_ = auVar88._12_4_ * fVar154;
      auVar87 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar87);
      auVar7 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar159);
      local_3c0 = ZEXT1632((undefined1  [16])aVar3);
      auVar88 = vsubps_avx512vl(_local_4c0,(undefined1  [16])aVar3);
      uVar144 = auVar88._0_4_;
      auVar89._4_4_ = uVar144;
      auVar89._0_4_ = uVar144;
      auVar89._8_4_ = uVar144;
      auVar89._12_4_ = uVar144;
      auVar87 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar203._0_4_ = auVar88._0_4_ * fVar162;
      auVar203._4_4_ = auVar88._4_4_ * fVar143;
      auVar203._8_4_ = auVar88._8_4_ * fVar153;
      auVar203._12_4_ = auVar88._12_4_ * fVar154;
      auVar87 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar5,auVar87);
      auVar8 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar89);
      lVar21 = (long)iVar77 * 0x44;
      auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar21);
      uVar144 = auVar91._0_4_;
      local_2c0._4_4_ = uVar144;
      local_2c0._0_4_ = uVar144;
      local_2c0._8_4_ = uVar144;
      local_2c0._12_4_ = uVar144;
      local_2c0._16_4_ = uVar144;
      local_2c0._20_4_ = uVar144;
      local_2c0._24_4_ = uVar144;
      local_2c0._28_4_ = uVar144;
      auVar145._8_4_ = 1;
      auVar145._0_8_ = 0x100000001;
      auVar145._12_4_ = 1;
      auVar145._16_4_ = 1;
      auVar145._20_4_ = 1;
      auVar145._24_4_ = 1;
      auVar145._28_4_ = 1;
      local_2e0 = vpermps_avx2(auVar145,ZEXT1632(auVar91));
      auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x484);
      uVar144 = auVar6._0_4_;
      auVar92._4_4_ = uVar144;
      auVar92._0_4_ = uVar144;
      auVar92._8_4_ = uVar144;
      auVar92._12_4_ = uVar144;
      local_300._16_4_ = uVar144;
      local_300._0_16_ = auVar92;
      local_300._20_4_ = uVar144;
      local_300._24_4_ = uVar144;
      local_300._28_4_ = uVar144;
      auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x908);
      local_320 = vpermps_avx512vl(auVar145,ZEXT1632(auVar6));
      local_340 = vbroadcastss_avx512vl(auVar7);
      local_360 = vpermps_avx512vl(auVar145,ZEXT1632(auVar7));
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0xd8c);
      fVar162 = auVar8._0_4_;
      local_380._4_4_ = fVar162;
      local_380._0_4_ = fVar162;
      fStack_378 = fVar162;
      fStack_374 = fVar162;
      fStack_370 = fVar162;
      fStack_36c = fVar162;
      fStack_368 = fVar162;
      register0x0000139c = fVar162;
      _local_3a0 = vpermps_avx512vl(auVar145,ZEXT1632(auVar8));
      auVar99 = vmulps_avx512vl(_local_380,auVar107);
      auVar97 = vmulps_avx512vl(_local_3a0,auVar107);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_340);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar108,local_360);
      auVar87 = vfmadd231ps_fma(auVar99,auVar96,local_300);
      auVar100 = vfmadd231ps_avx512vl(auVar97,auVar96,local_320);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar98,local_2c0);
      auVar192 = ZEXT3264(auVar101);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar21);
      auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x484);
      auVar95 = vfmadd231ps_avx512vl(auVar100,auVar98,local_2e0);
      auVar191 = ZEXT3264(auVar95);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x908);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0xd8c);
      auVar102 = vmulps_avx512vl(_local_380,auVar106);
      auVar103 = vmulps_avx512vl(_local_3a0,auVar106);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,local_340);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,local_360);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_300);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar97,local_320);
      auVar9 = vfmadd231ps_fma(auVar102,auVar99,local_2c0);
      auVar196 = ZEXT1664(auVar9);
      auVar10 = vfmadd231ps_fma(auVar103,auVar99,local_2e0);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar9),auVar101);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar10),auVar95);
      auVar102 = vmulps_avx512vl(auVar95,auVar103);
      auVar93 = vmulps_avx512vl(auVar101,auVar104);
      auVar102 = vsubps_avx512vl(auVar102,auVar93);
      auVar87 = vshufps_avx(local_4d0,local_4d0,0xff);
      uVar156 = auVar87._0_8_;
      local_a0._8_8_ = uVar156;
      local_a0._0_8_ = uVar156;
      local_a0._16_8_ = uVar156;
      local_a0._24_8_ = uVar156;
      auVar87 = vshufps_avx(local_4a0,local_4a0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar87);
      auVar87 = vshufps_avx512vl(local_4b0,local_4b0,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar87);
      auVar87 = vshufps_avx512vl(_local_4c0,_local_4c0,0xff);
      uVar156 = auVar87._0_8_;
      local_100._8_8_ = uVar156;
      local_100._0_8_ = uVar156;
      local_100._16_8_ = uVar156;
      local_100._24_8_ = uVar156;
      auVar93 = vmulps_avx512vl(local_100,auVar107);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_e0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_a0);
      auVar94 = vmulps_avx512vl(local_100,auVar106);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_e0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,local_c0);
      auVar11 = vfmadd231ps_fma(auVar94,auVar99,local_a0);
      auVar94 = vmulps_avx512vl(auVar104,auVar104);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar103,auVar103);
      auVar105 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar11));
      auVar105 = vmulps_avx512vl(auVar105,auVar105);
      auVar94 = vmulps_avx512vl(auVar105,auVar94);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      uVar156 = vcmpps_avx512vl(auVar102,auVar94,2);
      auVar87 = vblendps_avx(auVar91,local_4d0,8);
      auVar198 = auVar213._0_16_;
      auVar88 = vandps_avx512vl(auVar87,auVar198);
      auVar159 = local_4a0;
      auVar87 = vblendps_avx(auVar6,local_4a0,8);
      auVar87 = vandps_avx512vl(auVar87,auVar198);
      auVar88 = vmaxps_avx(auVar88,auVar87);
      auVar158 = local_4b0;
      auVar87 = vblendps_avx(auVar7,local_4b0,8);
      auVar89 = vandps_avx512vl(auVar87,auVar198);
      auVar157 = _local_4c0;
      auVar87 = vblendps_avx(auVar8,_local_4c0,8);
      auVar87 = vandps_avx512vl(auVar87,auVar198);
      auVar87 = vmaxps_avx(auVar89,auVar87);
      auVar87 = vmaxps_avx(auVar88,auVar87);
      auVar88 = vmovshdup_avx(auVar87);
      auVar88 = vmaxss_avx(auVar88,auVar87);
      auVar87 = vshufpd_avx(auVar87,auVar87,1);
      auVar87 = vmaxss_avx(auVar87,auVar88);
      auVar88 = vcvtsi2ss_avx512f(_local_4c0,iVar77);
      local_440._0_16_ = auVar88;
      auVar205._0_4_ = auVar88._0_4_;
      auVar205._4_4_ = auVar205._0_4_;
      auVar205._8_4_ = auVar205._0_4_;
      auVar205._12_4_ = auVar205._0_4_;
      auVar205._16_4_ = auVar205._0_4_;
      auVar205._20_4_ = auVar205._0_4_;
      auVar205._24_4_ = auVar205._0_4_;
      auVar205._28_4_ = auVar205._0_4_;
      uVar20 = vcmpps_avx512vl(auVar205,_DAT_01faff40,0xe);
      bVar83 = (byte)uVar156 & (byte)uVar20;
      auVar87 = vmulss_avx512f(auVar87,auVar214._0_16_);
      local_420._0_16_ = auVar87;
      auVar102 = local_420;
      auVar105 = auVar212._0_32_;
      auVar94 = vpermps_avx512vl(auVar105,ZEXT1632(auVar91));
      local_140 = vpermps_avx512vl(auVar105,ZEXT1632(auVar6));
      local_160 = vpermps_avx512vl(auVar105,ZEXT1632(auVar7));
      local_180 = vpermps_avx512vl(auVar105,ZEXT1632(auVar8));
      _local_4c0 = auVar157;
      local_4b0 = auVar158;
      local_4a0 = auVar159;
      local_420 = auVar102;
      if (bVar83 != 0) {
        auVar106 = vmulps_avx512vl(local_180,auVar106);
        auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar106);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_140,auVar100);
        auVar97 = vfmadd213ps_avx512vl(auVar99,auVar94,auVar97);
        auVar107 = vmulps_avx512vl(local_180,auVar107);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar107);
        auVar100 = vfmadd213ps_avx512vl(auVar96,local_140,auVar108);
        auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1210);
        auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1694);
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1b18);
        auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1f9c);
        auVar100 = vfmadd213ps_avx512vl(auVar98,auVar94,auVar100);
        auVar200._0_4_ = fVar162 * auVar99._0_4_;
        auVar200._4_4_ = fVar162 * auVar99._4_4_;
        auVar200._8_4_ = fVar162 * auVar99._8_4_;
        auVar200._12_4_ = fVar162 * auVar99._12_4_;
        auVar200._16_4_ = fVar162 * auVar99._16_4_;
        auVar200._20_4_ = fVar162 * auVar99._20_4_;
        auVar200._24_4_ = fVar162 * auVar99._24_4_;
        auVar200._28_4_ = 0;
        auVar98 = vmulps_avx512vl(_local_3a0,auVar99);
        auVar99 = vmulps_avx512vl(local_180,auVar99);
        auVar106 = vfmadd231ps_avx512vl(auVar200,auVar107,local_340);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_360);
        auVar107 = vfmadd231ps_avx512vl(auVar99,local_160,auVar107);
        auVar99 = vfmadd231ps_avx512vl(auVar106,auVar108,local_300);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar108,local_320);
        auVar106 = vfmadd231ps_avx512vl(auVar107,local_140,auVar108);
        auVar88 = vfmadd231ps_fma(auVar99,auVar96,local_2c0);
        auVar99 = vfmadd231ps_avx512vl(auVar98,auVar96,local_2e0);
        auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1210);
        auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1f9c);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar94,auVar96);
        auVar37._4_4_ = fVar162 * auVar107._4_4_;
        auVar37._0_4_ = fVar162 * auVar107._0_4_;
        auVar37._8_4_ = fVar162 * auVar107._8_4_;
        auVar37._12_4_ = fVar162 * auVar107._12_4_;
        auVar37._16_4_ = fVar162 * auVar107._16_4_;
        auVar37._20_4_ = fVar162 * auVar107._20_4_;
        auVar37._24_4_ = fVar162 * auVar107._24_4_;
        auVar37._28_4_ = auVar96._28_4_;
        auVar96 = vmulps_avx512vl(_local_3a0,auVar107);
        auVar107 = vmulps_avx512vl(local_180,auVar107);
        auVar102 = vfmadd231ps_avx512vl(auVar37,auVar108,local_340);
        auVar109 = vfmadd231ps_avx512vl(auVar96,auVar108,local_360);
        auVar211 = ZEXT3264(auVar94);
        auVar108 = vfmadd231ps_avx512vl(auVar107,local_160,auVar108);
        auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1694);
        auVar107 = vfmadd231ps_avx512vl(auVar102,auVar96,local_300);
        auVar102 = vfmadd231ps_avx512vl(auVar109,auVar96,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar108,local_140,auVar96);
        auVar214 = ZEXT1664(auVar214._0_16_);
        auVar212 = ZEXT3264(auVar105);
        auVar213 = ZEXT1664(auVar198);
        auVar91 = vfmadd231ps_fma(auVar107,auVar98,local_2c0);
        auVar108 = vfmadd231ps_avx512vl(auVar102,auVar98,local_2e0);
        auVar107 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar98);
        auVar209._8_4_ = 0x7fffffff;
        auVar209._0_8_ = 0x7fffffff7fffffff;
        auVar209._12_4_ = 0x7fffffff;
        auVar209._16_4_ = 0x7fffffff;
        auVar209._20_4_ = 0x7fffffff;
        auVar209._24_4_ = 0x7fffffff;
        auVar209._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(ZEXT1632(auVar88),auVar209);
        auVar96 = vandps_avx(auVar99,auVar209);
        auVar96 = vmaxps_avx(auVar98,auVar96);
        auVar98 = vandps_avx(auVar106,auVar209);
        auVar98 = vmaxps_avx(auVar96,auVar98);
        local_420._0_4_ = auVar87._0_4_;
        auVar204._4_4_ = local_420._0_4_;
        auVar204._0_4_ = local_420._0_4_;
        auVar204._8_4_ = local_420._0_4_;
        auVar204._12_4_ = local_420._0_4_;
        auVar204._16_4_ = local_420._0_4_;
        auVar204._20_4_ = local_420._0_4_;
        auVar204._24_4_ = local_420._0_4_;
        auVar204._28_4_ = local_420._0_4_;
        uVar72 = vcmpps_avx512vl(auVar98,auVar204,1);
        bVar14 = (bool)((byte)uVar72 & 1);
        auVar110._0_4_ = (float)((uint)bVar14 * auVar103._0_4_ | (uint)!bVar14 * auVar88._0_4_);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar88._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar88._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar88._12_4_);
        fVar153 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar103._16_4_);
        auVar110._16_4_ = fVar153;
        fVar162 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar103._20_4_);
        auVar110._20_4_ = fVar162;
        fVar143 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar103._24_4_);
        auVar110._24_4_ = fVar143;
        uVar74 = (uint)(byte)(uVar72 >> 7) * auVar103._28_4_;
        auVar110._28_4_ = uVar74;
        bVar14 = (bool)((byte)uVar72 & 1);
        auVar111._0_4_ = (float)((uint)bVar14 * auVar104._0_4_ | (uint)!bVar14 * auVar99._0_4_);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar99._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar99._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar99._12_4_);
        bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar99._16_4_);
        bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar99._20_4_);
        bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar99._24_4_);
        bVar14 = SUB81(uVar72 >> 7,0);
        auVar111._28_4_ = (uint)bVar14 * auVar104._28_4_ | (uint)!bVar14 * auVar99._28_4_;
        auVar98 = vandps_avx(auVar209,ZEXT1632(auVar91));
        auVar96 = vandps_avx(auVar108,auVar209);
        auVar96 = vmaxps_avx(auVar98,auVar96);
        auVar98 = vandps_avx(auVar107,auVar209);
        auVar98 = vmaxps_avx(auVar96,auVar98);
        uVar72 = vcmpps_avx512vl(auVar98,auVar204,1);
        bVar14 = (bool)((byte)uVar72 & 1);
        auVar112._0_4_ = (float)((uint)bVar14 * auVar103._0_4_ | (uint)!bVar14 * auVar91._0_4_);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar91._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar91._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar91._12_4_);
        fVar174 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar103._16_4_);
        auVar112._16_4_ = fVar174;
        fVar155 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar103._20_4_);
        auVar112._20_4_ = fVar155;
        fVar154 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar103._24_4_);
        auVar112._24_4_ = fVar154;
        auVar112._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar103._28_4_;
        bVar14 = (bool)((byte)uVar72 & 1);
        auVar113._0_4_ = (float)((uint)bVar14 * auVar104._0_4_ | (uint)!bVar14 * auVar108._0_4_);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar108._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar108._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar108._12_4_);
        bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar108._16_4_);
        bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar108._20_4_);
        bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar108._24_4_);
        bVar14 = SUB81(uVar72 >> 7,0);
        auVar113._28_4_ = (uint)bVar14 * auVar104._28_4_ | (uint)!bVar14 * auVar108._28_4_;
        auVar90 = vxorps_avx512vl(auVar92,auVar92);
        auVar98 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar90));
        auVar87 = vfmadd231ps_fma(auVar98,auVar111,auVar111);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar85 = auVar98._0_4_;
        fVar86 = auVar98._4_4_;
        fVar175 = auVar98._8_4_;
        fVar135 = auVar98._12_4_;
        fVar136 = auVar98._16_4_;
        fVar137 = auVar98._20_4_;
        fVar139 = auVar98._24_4_;
        auVar38._4_4_ = fVar86 * fVar86 * fVar86 * auVar87._4_4_ * -0.5;
        auVar38._0_4_ = fVar85 * fVar85 * fVar85 * auVar87._0_4_ * -0.5;
        auVar38._8_4_ = fVar175 * fVar175 * fVar175 * auVar87._8_4_ * -0.5;
        auVar38._12_4_ = fVar135 * fVar135 * fVar135 * auVar87._12_4_ * -0.5;
        auVar38._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar38._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar38._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar38._28_4_ = 0;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar108 = vfmadd231ps_avx512vl(auVar38,auVar96,auVar98);
        auVar39._4_4_ = auVar111._4_4_ * auVar108._4_4_;
        auVar39._0_4_ = auVar111._0_4_ * auVar108._0_4_;
        auVar39._8_4_ = auVar111._8_4_ * auVar108._8_4_;
        auVar39._12_4_ = auVar111._12_4_ * auVar108._12_4_;
        auVar39._16_4_ = auVar111._16_4_ * auVar108._16_4_;
        auVar39._20_4_ = auVar111._20_4_ * auVar108._20_4_;
        auVar39._24_4_ = auVar111._24_4_ * auVar108._24_4_;
        auVar39._28_4_ = auVar98._28_4_;
        auVar40._4_4_ = auVar108._4_4_ * -auVar110._4_4_;
        auVar40._0_4_ = auVar108._0_4_ * -auVar110._0_4_;
        auVar40._8_4_ = auVar108._8_4_ * -auVar110._8_4_;
        auVar40._12_4_ = auVar108._12_4_ * -auVar110._12_4_;
        auVar40._16_4_ = auVar108._16_4_ * -fVar153;
        auVar40._20_4_ = auVar108._20_4_ * -fVar162;
        auVar40._24_4_ = auVar108._24_4_ * -fVar143;
        auVar40._28_4_ = uVar74 ^ 0x80000000;
        auVar98 = vmulps_avx512vl(auVar108,ZEXT1632(auVar90));
        auVar102 = ZEXT1632(auVar90);
        auVar107 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar102);
        auVar87 = vfmadd231ps_fma(auVar107,auVar113,auVar113);
        auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar162 = auVar107._0_4_;
        fVar143 = auVar107._4_4_;
        fVar153 = auVar107._8_4_;
        fVar85 = auVar107._12_4_;
        fVar86 = auVar107._16_4_;
        fVar175 = auVar107._20_4_;
        fVar135 = auVar107._24_4_;
        auVar41._4_4_ = fVar143 * fVar143 * fVar143 * auVar87._4_4_ * -0.5;
        auVar41._0_4_ = fVar162 * fVar162 * fVar162 * auVar87._0_4_ * -0.5;
        auVar41._8_4_ = fVar153 * fVar153 * fVar153 * auVar87._8_4_ * -0.5;
        auVar41._12_4_ = fVar85 * fVar85 * fVar85 * auVar87._12_4_ * -0.5;
        auVar41._16_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar41._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar41._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar41._28_4_ = 0;
        auVar96 = vfmadd231ps_avx512vl(auVar41,auVar96,auVar107);
        auVar42._4_4_ = auVar113._4_4_ * auVar96._4_4_;
        auVar42._0_4_ = auVar113._0_4_ * auVar96._0_4_;
        auVar42._8_4_ = auVar113._8_4_ * auVar96._8_4_;
        auVar42._12_4_ = auVar113._12_4_ * auVar96._12_4_;
        auVar42._16_4_ = auVar113._16_4_ * auVar96._16_4_;
        auVar42._20_4_ = auVar113._20_4_ * auVar96._20_4_;
        auVar42._24_4_ = auVar113._24_4_ * auVar96._24_4_;
        auVar42._28_4_ = auVar107._28_4_;
        auVar43._4_4_ = -auVar112._4_4_ * auVar96._4_4_;
        auVar43._0_4_ = -auVar112._0_4_ * auVar96._0_4_;
        auVar43._8_4_ = -auVar112._8_4_ * auVar96._8_4_;
        auVar43._12_4_ = -auVar112._12_4_ * auVar96._12_4_;
        auVar43._16_4_ = -fVar174 * auVar96._16_4_;
        auVar43._20_4_ = -fVar155 * auVar96._20_4_;
        auVar43._24_4_ = -fVar154 * auVar96._24_4_;
        auVar43._28_4_ = auVar108._28_4_;
        auVar96 = vmulps_avx512vl(auVar96,auVar102);
        auVar87 = vfmadd213ps_fma(auVar39,auVar93,auVar101);
        auVar88 = vfmadd213ps_fma(auVar40,auVar93,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar98,auVar93,auVar100);
        auVar107 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar11),ZEXT1632(auVar9));
        auVar89 = vfnmadd213ps_fma(auVar39,auVar93,auVar101);
        auVar106 = ZEXT1632(auVar11);
        auVar91 = vfmadd213ps_fma(auVar43,auVar106,ZEXT1632(auVar10));
        auVar92 = vfnmadd213ps_fma(auVar40,auVar93,auVar95);
        auVar6 = vfmadd213ps_fma(auVar96,auVar106,auVar97);
        auVar99 = vfnmadd231ps_avx512vl(auVar100,auVar93,auVar98);
        auVar9 = vfnmadd213ps_fma(auVar42,auVar106,ZEXT1632(auVar9));
        auVar10 = vfnmadd213ps_fma(auVar43,auVar106,ZEXT1632(auVar10));
        auVar198 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar11),auVar96);
        auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar89));
        auVar98 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar92));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar6),auVar99);
        auVar100 = vmulps_avx512vl(auVar98,auVar99);
        auVar7 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar92),auVar97);
        auVar44._4_4_ = auVar89._4_4_ * auVar97._4_4_;
        auVar44._0_4_ = auVar89._0_4_ * auVar97._0_4_;
        auVar44._8_4_ = auVar89._8_4_ * auVar97._8_4_;
        auVar44._12_4_ = auVar89._12_4_ * auVar97._12_4_;
        auVar44._16_4_ = auVar97._16_4_ * 0.0;
        auVar44._20_4_ = auVar97._20_4_ * 0.0;
        auVar44._24_4_ = auVar97._24_4_ * 0.0;
        auVar44._28_4_ = auVar97._28_4_;
        auVar97 = vfmsub231ps_avx512vl(auVar44,auVar99,auVar96);
        auVar45._4_4_ = auVar92._4_4_ * auVar96._4_4_;
        auVar45._0_4_ = auVar92._0_4_ * auVar96._0_4_;
        auVar45._8_4_ = auVar92._8_4_ * auVar96._8_4_;
        auVar45._12_4_ = auVar92._12_4_ * auVar96._12_4_;
        auVar45._16_4_ = auVar96._16_4_ * 0.0;
        auVar45._20_4_ = auVar96._20_4_ * 0.0;
        auVar45._24_4_ = auVar96._24_4_ * 0.0;
        auVar45._28_4_ = auVar96._28_4_;
        auVar8 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar89),auVar98);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar102,auVar97);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,ZEXT1632(auVar7));
        auVar103 = ZEXT1632(auVar90);
        uVar72 = vcmpps_avx512vl(auVar98,auVar103,2);
        bVar71 = (byte)uVar72;
        fVar85 = (float)((uint)(bVar71 & 1) * auVar87._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar9._0_4_);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        fVar175 = (float)((uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * auVar9._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        fVar136 = (float)((uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * auVar9._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        fVar139 = (float)((uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * auVar9._12_4_);
        auVar100 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar175,fVar85))));
        fVar86 = (float)((uint)(bVar71 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar10._0_4_);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        fVar135 = (float)((uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar10._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        fVar137 = (float)((uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar10._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        fVar140 = (float)((uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar10._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar135,fVar86))));
        auVar114._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar108._0_4_ |
                    (uint)!(bool)(bVar71 & 1) * auVar198._0_4_);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar198._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar198._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar198._12_4_);
        fVar153 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar108._16_4_);
        auVar114._16_4_ = fVar153;
        fVar143 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar108._20_4_);
        auVar114._20_4_ = fVar143;
        fVar162 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar108._24_4_);
        auVar114._24_4_ = fVar162;
        iVar1 = (uint)(byte)(uVar72 >> 7) * auVar108._28_4_;
        auVar114._28_4_ = iVar1;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar89),auVar107);
        auVar115._0_4_ =
             (uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar7._0_4_;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar7._4_4_;
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar7._8_4_;
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar7._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar96._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar96._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar96._24_4_;
        auVar115._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar91));
        auVar116._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar88._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar88._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar88._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar88._12_4_);
        fVar174 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar96._16_4_);
        auVar116._16_4_ = fVar174;
        fVar155 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar96._20_4_);
        auVar116._20_4_ = fVar155;
        fVar154 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar96._24_4_);
        auVar116._24_4_ = fVar154;
        auVar116._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(auVar99,ZEXT1632(auVar6));
        auVar117._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar108._0_4_
                    );
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar108._4_4_);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar108._8_4_);
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar108._12_4_);
        bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar108._16_4_);
        bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar108._20_4_);
        bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar108._24_4_);
        bVar14 = SUB81(uVar72 >> 7,0);
        auVar117._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar108._28_4_;
        auVar118._0_4_ =
             (uint)(bVar71 & 1) * (int)auVar89._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar107._0_4_;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar14 * (int)auVar89._4_4_ | (uint)!bVar14 * auVar107._4_4_;
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar14 * (int)auVar89._8_4_ | (uint)!bVar14 * auVar107._8_4_;
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar14 * (int)auVar89._12_4_ | (uint)!bVar14 * auVar107._12_4_;
        auVar118._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_;
        auVar118._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_;
        auVar118._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_;
        auVar118._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar107._28_4_;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar119._0_4_ =
             (uint)(bVar71 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar6._0_4_;
        bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar6._4_4_;
        bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar6._8_4_;
        bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar6._12_4_;
        auVar119._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar99._16_4_;
        auVar119._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar99._20_4_;
        auVar119._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar99._24_4_;
        iVar2 = (uint)(byte)(uVar72 >> 7) * auVar99._28_4_;
        auVar119._28_4_ = iVar2;
        auVar102 = vsubps_avx512vl(auVar118,auVar100);
        auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar92._12_4_ |
                                                (uint)!bVar17 * auVar91._12_4_,
                                                CONCAT48((uint)bVar16 * (int)auVar92._8_4_ |
                                                         (uint)!bVar16 * auVar91._8_4_,
                                                         CONCAT44((uint)bVar14 * (int)auVar92._4_4_
                                                                  | (uint)!bVar14 * auVar91._4_4_,
                                                                  (uint)(bVar71 & 1) *
                                                                  (int)auVar92._0_4_ |
                                                                  (uint)!(bool)(bVar71 & 1) *
                                                                  auVar91._0_4_)))),auVar106);
        auVar192 = ZEXT3264(auVar96);
        auVar108 = vsubps_avx(auVar119,auVar114);
        auVar107 = vsubps_avx(auVar100,auVar115);
        auVar196 = ZEXT3264(auVar107);
        auVar99 = vsubps_avx(auVar106,auVar116);
        auVar97 = vsubps_avx(auVar114,auVar117);
        auVar46._4_4_ = auVar108._4_4_ * fVar175;
        auVar46._0_4_ = auVar108._0_4_ * fVar85;
        auVar46._8_4_ = auVar108._8_4_ * fVar136;
        auVar46._12_4_ = auVar108._12_4_ * fVar139;
        auVar46._16_4_ = auVar108._16_4_ * 0.0;
        auVar46._20_4_ = auVar108._20_4_ * 0.0;
        auVar46._24_4_ = auVar108._24_4_ * 0.0;
        auVar46._28_4_ = iVar2;
        auVar87 = vfmsub231ps_fma(auVar46,auVar114,auVar102);
        auVar47._4_4_ = fVar135 * auVar102._4_4_;
        auVar47._0_4_ = fVar86 * auVar102._0_4_;
        auVar47._8_4_ = fVar137 * auVar102._8_4_;
        auVar47._12_4_ = fVar140 * auVar102._12_4_;
        auVar47._16_4_ = auVar102._16_4_ * 0.0;
        auVar47._20_4_ = auVar102._20_4_ * 0.0;
        auVar47._24_4_ = auVar102._24_4_ * 0.0;
        auVar47._28_4_ = auVar98._28_4_;
        auVar88 = vfmsub231ps_fma(auVar47,auVar100,auVar96);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar103,ZEXT1632(auVar87));
        auVar187._0_4_ = auVar96._0_4_ * auVar114._0_4_;
        auVar187._4_4_ = auVar96._4_4_ * auVar114._4_4_;
        auVar187._8_4_ = auVar96._8_4_ * auVar114._8_4_;
        auVar187._12_4_ = auVar96._12_4_ * auVar114._12_4_;
        auVar187._16_4_ = auVar96._16_4_ * fVar153;
        auVar187._20_4_ = auVar96._20_4_ * fVar143;
        auVar187._24_4_ = auVar96._24_4_ * fVar162;
        auVar187._28_4_ = 0;
        auVar87 = vfmsub231ps_fma(auVar187,auVar106,auVar108);
        auVar101 = vfmadd231ps_avx512vl(auVar98,auVar103,ZEXT1632(auVar87));
        auVar98 = vmulps_avx512vl(auVar97,auVar115);
        auVar98 = vfmsub231ps_avx512vl(auVar98,auVar107,auVar117);
        auVar48._4_4_ = auVar99._4_4_ * auVar117._4_4_;
        auVar48._0_4_ = auVar99._0_4_ * auVar117._0_4_;
        auVar48._8_4_ = auVar99._8_4_ * auVar117._8_4_;
        auVar48._12_4_ = auVar99._12_4_ * auVar117._12_4_;
        auVar48._16_4_ = auVar99._16_4_ * auVar117._16_4_;
        auVar48._20_4_ = auVar99._20_4_ * auVar117._20_4_;
        auVar48._24_4_ = auVar99._24_4_ * auVar117._24_4_;
        auVar48._28_4_ = auVar117._28_4_;
        auVar87 = vfmsub231ps_fma(auVar48,auVar116,auVar97);
        auVar188._0_4_ = auVar116._0_4_ * auVar107._0_4_;
        auVar188._4_4_ = auVar116._4_4_ * auVar107._4_4_;
        auVar188._8_4_ = auVar116._8_4_ * auVar107._8_4_;
        auVar188._12_4_ = auVar116._12_4_ * auVar107._12_4_;
        auVar188._16_4_ = fVar174 * auVar107._16_4_;
        auVar188._20_4_ = fVar155 * auVar107._20_4_;
        auVar188._24_4_ = fVar154 * auVar107._24_4_;
        auVar188._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar188,auVar99,auVar115);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar103,auVar98);
        auVar95 = vfmadd231ps_avx512vl(auVar98,auVar103,ZEXT1632(auVar87));
        auVar191 = ZEXT3264(auVar95);
        auVar98 = vmaxps_avx(auVar101,auVar95);
        uVar156 = vcmpps_avx512vl(auVar98,auVar103,2);
        bVar83 = bVar83 & (byte)uVar156;
        if (bVar83 != 0) {
          auVar49._4_4_ = auVar97._4_4_ * auVar96._4_4_;
          auVar49._0_4_ = auVar97._0_4_ * auVar96._0_4_;
          auVar49._8_4_ = auVar97._8_4_ * auVar96._8_4_;
          auVar49._12_4_ = auVar97._12_4_ * auVar96._12_4_;
          auVar49._16_4_ = auVar97._16_4_ * auVar96._16_4_;
          auVar49._20_4_ = auVar97._20_4_ * auVar96._20_4_;
          auVar49._24_4_ = auVar97._24_4_ * auVar96._24_4_;
          auVar49._28_4_ = auVar98._28_4_;
          auVar6 = vfmsub231ps_fma(auVar49,auVar99,auVar108);
          auVar50._4_4_ = auVar108._4_4_ * auVar107._4_4_;
          auVar50._0_4_ = auVar108._0_4_ * auVar107._0_4_;
          auVar50._8_4_ = auVar108._8_4_ * auVar107._8_4_;
          auVar50._12_4_ = auVar108._12_4_ * auVar107._12_4_;
          auVar50._16_4_ = auVar108._16_4_ * auVar107._16_4_;
          auVar50._20_4_ = auVar108._20_4_ * auVar107._20_4_;
          auVar50._24_4_ = auVar108._24_4_ * auVar107._24_4_;
          auVar50._28_4_ = auVar108._28_4_;
          auVar91 = vfmsub231ps_fma(auVar50,auVar102,auVar97);
          auVar51._4_4_ = auVar99._4_4_ * auVar102._4_4_;
          auVar51._0_4_ = auVar99._0_4_ * auVar102._0_4_;
          auVar51._8_4_ = auVar99._8_4_ * auVar102._8_4_;
          auVar51._12_4_ = auVar99._12_4_ * auVar102._12_4_;
          auVar51._16_4_ = auVar99._16_4_ * auVar102._16_4_;
          auVar51._20_4_ = auVar99._20_4_ * auVar102._20_4_;
          auVar51._24_4_ = auVar99._24_4_ * auVar102._24_4_;
          auVar51._28_4_ = auVar99._28_4_;
          auVar7 = vfmsub231ps_fma(auVar51,auVar107,auVar96);
          auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar7));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT1632(auVar6),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar98 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
          auVar196 = ZEXT3264(auVar98);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = 0x3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar96 = vfnmadd213ps_avx512vl(auVar98,ZEXT1632(auVar88),auVar26);
          auVar87 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
          auVar192 = ZEXT1664(auVar87);
          auVar52._4_4_ = auVar7._4_4_ * auVar114._4_4_;
          auVar52._0_4_ = auVar7._0_4_ * auVar114._0_4_;
          auVar52._8_4_ = auVar7._8_4_ * auVar114._8_4_;
          auVar52._12_4_ = auVar7._12_4_ * auVar114._12_4_;
          auVar52._16_4_ = fVar153 * 0.0;
          auVar52._20_4_ = fVar143 * 0.0;
          auVar52._24_4_ = fVar162 * 0.0;
          auVar52._28_4_ = iVar1;
          auVar91 = vfmadd231ps_fma(auVar52,auVar106,ZEXT1632(auVar91));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar100,ZEXT1632(auVar6));
          fVar143 = auVar87._0_4_;
          fVar153 = auVar87._4_4_;
          fVar154 = auVar87._8_4_;
          fVar155 = auVar87._12_4_;
          local_260 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar155,
                                         CONCAT48(auVar91._8_4_ * fVar154,
                                                  CONCAT44(auVar91._4_4_ * fVar153,
                                                           auVar91._0_4_ * fVar143))));
          auVar199 = ZEXT3264(local_260);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar98 = vpermps_avx2(auVar146,ZEXT1632((undefined1  [16])aVar3));
          uVar156 = vcmpps_avx512vl(auVar98,local_260,2);
          fVar162 = (ray->super_RayK<1>).tfar;
          auVar27._4_4_ = fVar162;
          auVar27._0_4_ = fVar162;
          auVar27._8_4_ = fVar162;
          auVar27._12_4_ = fVar162;
          auVar27._16_4_ = fVar162;
          auVar27._20_4_ = fVar162;
          auVar27._24_4_ = fVar162;
          auVar27._28_4_ = fVar162;
          uVar20 = vcmpps_avx512vl(local_260,auVar27,2);
          bVar83 = (byte)uVar156 & (byte)uVar20 & bVar83;
          if (bVar83 != 0) {
            uVar84 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar84 = bVar83 & uVar84;
            if ((char)uVar84 != '\0') {
              fVar162 = auVar101._0_4_ * fVar143;
              fVar174 = auVar101._4_4_ * fVar153;
              auVar53._4_4_ = fVar174;
              auVar53._0_4_ = fVar162;
              fVar85 = auVar101._8_4_ * fVar154;
              auVar53._8_4_ = fVar85;
              fVar86 = auVar101._12_4_ * fVar155;
              auVar53._12_4_ = fVar86;
              fVar175 = auVar101._16_4_ * 0.0;
              auVar53._16_4_ = fVar175;
              fVar135 = auVar101._20_4_ * 0.0;
              auVar53._20_4_ = fVar135;
              fVar136 = auVar101._24_4_ * 0.0;
              auVar53._24_4_ = fVar136;
              auVar53._28_4_ = auVar101._28_4_;
              auVar147._8_4_ = 0x3f800000;
              auVar147._0_8_ = 0x3f8000003f800000;
              auVar147._12_4_ = 0x3f800000;
              auVar147._16_4_ = 0x3f800000;
              auVar147._20_4_ = 0x3f800000;
              auVar147._24_4_ = 0x3f800000;
              auVar147._28_4_ = 0x3f800000;
              auVar98 = vsubps_avx(auVar147,auVar53);
              local_2a0._0_4_ =
                   (float)((uint)(bVar71 & 1) * (int)fVar162 |
                          (uint)!(bool)(bVar71 & 1) * auVar98._0_4_);
              bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
              local_2a0._4_4_ = (float)((uint)bVar14 * (int)fVar174 | (uint)!bVar14 * auVar98._4_4_)
              ;
              bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
              local_2a0._8_4_ = (float)((uint)bVar14 * (int)fVar85 | (uint)!bVar14 * auVar98._8_4_);
              bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
              local_2a0._12_4_ =
                   (float)((uint)bVar14 * (int)fVar86 | (uint)!bVar14 * auVar98._12_4_);
              bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
              local_2a0._16_4_ =
                   (float)((uint)bVar14 * (int)fVar175 | (uint)!bVar14 * auVar98._16_4_);
              bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
              local_2a0._20_4_ =
                   (float)((uint)bVar14 * (int)fVar135 | (uint)!bVar14 * auVar98._20_4_);
              bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
              local_2a0._24_4_ =
                   (float)((uint)bVar14 * (int)fVar136 | (uint)!bVar14 * auVar98._24_4_);
              bVar14 = SUB81(uVar72 >> 7,0);
              local_2a0._28_4_ =
                   (float)((uint)bVar14 * auVar101._28_4_ | (uint)!bVar14 * auVar98._28_4_);
              auVar98 = vsubps_avx(ZEXT1632(auVar11),auVar93);
              auVar87 = vfmadd213ps_fma(auVar98,local_2a0,auVar93);
              fVar162 = pre->depth_scale;
              auVar28._4_4_ = fVar162;
              auVar28._0_4_ = fVar162;
              auVar28._8_4_ = fVar162;
              auVar28._12_4_ = fVar162;
              auVar28._16_4_ = fVar162;
              auVar28._20_4_ = fVar162;
              auVar28._24_4_ = fVar162;
              auVar28._28_4_ = fVar162;
              auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                           CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                    CONCAT44(auVar87._4_4_ +
                                                                             auVar87._4_4_,
                                                                             auVar87._0_4_ +
                                                                             auVar87._0_4_)))),
                                        auVar28);
              uVar78 = vcmpps_avx512vl(local_260,auVar98,6);
              uVar84 = uVar84 & uVar78;
              bVar83 = (byte)uVar84;
              if (bVar83 != 0) {
                auVar172._0_4_ = auVar95._0_4_ * fVar143;
                auVar172._4_4_ = auVar95._4_4_ * fVar153;
                auVar172._8_4_ = auVar95._8_4_ * fVar154;
                auVar172._12_4_ = auVar95._12_4_ * fVar155;
                auVar172._16_4_ = auVar95._16_4_ * 0.0;
                auVar172._20_4_ = auVar95._20_4_ * 0.0;
                auVar172._24_4_ = auVar95._24_4_ * 0.0;
                auVar172._28_4_ = 0;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar98 = vsubps_avx(auVar176,auVar172);
                auVar120._0_4_ =
                     (uint)(bVar71 & 1) * (int)auVar172._0_4_ |
                     (uint)!(bool)(bVar71 & 1) * auVar98._0_4_;
                bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
                auVar120._4_4_ = (uint)bVar14 * (int)auVar172._4_4_ | (uint)!bVar14 * auVar98._4_4_;
                bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                auVar120._8_4_ = (uint)bVar14 * (int)auVar172._8_4_ | (uint)!bVar14 * auVar98._8_4_;
                bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
                auVar120._12_4_ =
                     (uint)bVar14 * (int)auVar172._12_4_ | (uint)!bVar14 * auVar98._12_4_;
                bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                auVar120._16_4_ =
                     (uint)bVar14 * (int)auVar172._16_4_ | (uint)!bVar14 * auVar98._16_4_;
                bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
                auVar120._20_4_ =
                     (uint)bVar14 * (int)auVar172._20_4_ | (uint)!bVar14 * auVar98._20_4_;
                bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
                auVar120._24_4_ =
                     (uint)bVar14 * (int)auVar172._24_4_ | (uint)!bVar14 * auVar98._24_4_;
                auVar120._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar98._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_280 = vfmsub132ps_avx512vl(auVar120,auVar176,auVar29);
                local_240 = 0;
                local_23c = iVar77;
                auVar196 = ZEXT1664(local_4d0);
                local_230 = local_4d0;
                local_220 = local_4a0._0_8_;
                uStack_218 = local_4a0._8_8_;
                local_210 = local_4b0._0_8_;
                uStack_208 = local_4b0._8_8_;
                local_200 = local_4c0;
                uStack_1f8 = uStack_4b8;
                if ((pGVar76->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar162 = 1.0 / auVar205._0_4_;
                  local_1e0[0] = fVar162 * (local_2a0._0_4_ + 0.0);
                  local_1e0[1] = fVar162 * (local_2a0._4_4_ + 1.0);
                  local_1e0[2] = fVar162 * (local_2a0._8_4_ + 2.0);
                  local_1e0[3] = fVar162 * (local_2a0._12_4_ + 3.0);
                  fStack_1d0 = fVar162 * (local_2a0._16_4_ + 4.0);
                  fStack_1cc = fVar162 * (local_2a0._20_4_ + 5.0);
                  fStack_1c8 = fVar162 * (local_2a0._24_4_ + 6.0);
                  fStack_1c4 = local_2a0._28_4_ + 7.0;
                  local_1c0 = local_280;
                  local_1a0 = local_260;
                  auVar148._8_4_ = 0x7f800000;
                  auVar148._0_8_ = 0x7f8000007f800000;
                  auVar148._12_4_ = 0x7f800000;
                  auVar148._16_4_ = 0x7f800000;
                  auVar148._20_4_ = 0x7f800000;
                  auVar148._24_4_ = 0x7f800000;
                  auVar148._28_4_ = 0x7f800000;
                  auVar98 = vblendmps_avx512vl(auVar148,local_260);
                  auVar121._0_4_ =
                       (uint)(bVar83 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar84 >> 1) & 1);
                  auVar121._4_4_ = (uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                  auVar121._8_4_ = (uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar84 >> 3) & 1);
                  auVar121._12_4_ = (uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                  auVar121._16_4_ = (uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar84 >> 5) & 1);
                  auVar121._20_4_ = (uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar84 >> 6) & 1);
                  auVar121._24_4_ = (uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = SUB81(uVar84 >> 7,0);
                  auVar121._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar98 = vshufps_avx(auVar121,auVar121,0xb1);
                  auVar98 = vminps_avx(auVar121,auVar98);
                  auVar96 = vshufpd_avx(auVar98,auVar98,5);
                  auVar98 = vminps_avx(auVar98,auVar96);
                  auVar96 = vpermpd_avx2(auVar98,0x4e);
                  auVar98 = vminps_avx(auVar98,auVar96);
                  uVar156 = vcmpps_avx512vl(auVar121,auVar98,0);
                  uVar74 = (uint)uVar84;
                  if (((byte)uVar156 & bVar83) != 0) {
                    uVar74 = (uint)((byte)uVar156 & bVar83);
                  }
                  uVar73 = 0;
                  for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                    uVar73 = uVar73 + 1;
                  }
                  uVar72 = (ulong)uVar73;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_3e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_540 = pGVar76;
                    _local_400 = local_260;
                    local_460 = auVar94;
                    do {
                      local_484 = local_1e0[uVar72];
                      local_480 = *(undefined4 *)(local_1c0 + uVar72 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar72 * 4);
                      local_508.context = context->user;
                      fVar162 = 1.0 - local_484;
                      auVar25._8_4_ = 0x80000000;
                      auVar25._0_8_ = 0x8000000080000000;
                      auVar25._12_4_ = 0x80000000;
                      auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar162),auVar25);
                      auVar87 = ZEXT416((uint)(local_484 * fVar162 * 4.0));
                      auVar88 = vfnmsub213ss_fma(ZEXT416((uint)local_484),ZEXT416((uint)local_484),
                                                 auVar87);
                      auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),
                                                auVar87);
                      fVar162 = fVar162 * auVar91._0_4_ * 0.5;
                      fVar143 = auVar88._0_4_ * 0.5;
                      auVar192 = ZEXT464((uint)fVar143);
                      fVar153 = auVar87._0_4_ * 0.5;
                      fVar154 = local_484 * local_484 * 0.5;
                      auVar185._0_4_ = fVar154 * (float)local_4c0._0_4_;
                      auVar185._4_4_ = fVar154 * (float)local_4c0._4_4_;
                      auVar185._8_4_ = fVar154 * (float)uStack_4b8;
                      auVar185._12_4_ = fVar154 * uStack_4b8._4_4_;
                      auVar169._4_4_ = fVar153;
                      auVar169._0_4_ = fVar153;
                      auVar169._8_4_ = fVar153;
                      auVar169._12_4_ = fVar153;
                      auVar87 = vfmadd132ps_fma(auVar169,auVar185,local_4b0);
                      auVar186._4_4_ = fVar143;
                      auVar186._0_4_ = fVar143;
                      auVar186._8_4_ = fVar143;
                      auVar186._12_4_ = fVar143;
                      auVar87 = vfmadd132ps_fma(auVar186,auVar87,local_4a0);
                      auVar191 = ZEXT1664(auVar87);
                      auVar170._4_4_ = fVar162;
                      auVar170._0_4_ = fVar162;
                      auVar170._8_4_ = fVar162;
                      auVar170._12_4_ = fVar162;
                      auVar88 = vfmadd213ps_fma(auVar170,auVar196._0_16_,auVar87);
                      local_490 = vmovlps_avx(auVar88);
                      local_488 = vextractps_avx(auVar88,2);
                      local_47c = uVar80;
                      local_478 = (int)local_538;
                      local_474 = (local_508.context)->instID[0];
                      local_470 = (local_508.context)->instPrimID[0];
                      local_544 = -1;
                      local_508.valid = &local_544;
                      local_508.geometryUserPtr = pGVar76->userPtr;
                      local_508.ray = (RTCRayN *)ray;
                      local_508.hit = (RTCHitN *)&local_490;
                      local_508.N = 1;
                      if (pGVar76->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01cb69f4:
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar76->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar191 = ZEXT1664(auVar191._0_16_);
                          auVar192 = ZEXT1664(auVar192._0_16_);
                          (*p_Var13)(&local_508);
                          auVar199 = ZEXT3264(_local_400);
                          auVar211 = ZEXT3264(local_460);
                          auVar196 = ZEXT1664(local_4d0);
                          auVar214 = ZEXT464(0x35000000);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar213 = ZEXT1664(auVar87);
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar212 = ZEXT3264(auVar98);
                          pGVar76 = local_540;
                          ray = local_530;
                          context = local_528;
                          if (*local_508.valid == 0) goto LAB_01cb6ac2;
                        }
                        (((Vec3f *)((long)local_508.ray + 0x30))->field_0).components[0] =
                             *(float *)local_508.hit;
                        (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_508.hit + 4);
                        (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_508.hit + 8);
                        *(float *)((long)local_508.ray + 0x3c) = *(float *)(local_508.hit + 0xc);
                        *(float *)((long)local_508.ray + 0x40) = *(float *)(local_508.hit + 0x10);
                        *(float *)((long)local_508.ray + 0x44) = *(float *)(local_508.hit + 0x14);
                        *(float *)((long)local_508.ray + 0x48) = *(float *)(local_508.hit + 0x18);
                        *(float *)((long)local_508.ray + 0x4c) = *(float *)(local_508.hit + 0x1c);
                        *(float *)((long)local_508.ray + 0x50) = *(float *)(local_508.hit + 0x20);
                      }
                      else {
                        auVar191 = ZEXT1664(auVar87);
                        auVar192 = ZEXT464((uint)fVar143);
                        (*pGVar76->intersectionFilterN)(&local_508);
                        auVar199 = ZEXT3264(_local_400);
                        auVar211 = ZEXT3264(local_460);
                        auVar196 = ZEXT1664(local_4d0);
                        auVar214 = ZEXT464(0x35000000);
                        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar213 = ZEXT1664(auVar87);
                        auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar212 = ZEXT3264(auVar98);
                        pGVar76 = local_540;
                        ray = local_530;
                        context = local_528;
                        if (*local_508.valid != 0) goto LAB_01cb69f4;
LAB_01cb6ac2:
                        auVar214 = ZEXT464(0x35000000);
                        (local_530->super_RayK<1>).tfar = (float)local_3e0._0_4_;
                        pGVar76 = local_540;
                        ray = local_530;
                        context = local_528;
                      }
                      auVar94 = auVar211._0_32_;
                      bVar83 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar84;
                      fVar162 = (ray->super_RayK<1>).tfar;
                      auVar36._4_4_ = fVar162;
                      auVar36._0_4_ = fVar162;
                      auVar36._8_4_ = fVar162;
                      auVar36._12_4_ = fVar162;
                      auVar36._16_4_ = fVar162;
                      auVar36._20_4_ = fVar162;
                      auVar36._24_4_ = fVar162;
                      auVar36._28_4_ = fVar162;
                      uVar156 = vcmpps_avx512vl(auVar199._0_32_,auVar36,2);
                      prim = local_510;
                      pre = local_518;
                      pPVar79 = local_520;
                      if ((bVar83 & (byte)uVar156) == 0) goto LAB_01cb5bcd;
                      local_3e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar83 = bVar83 & (byte)uVar156;
                      uVar84 = (ulong)bVar83;
                      auVar152._8_4_ = 0x7f800000;
                      auVar152._0_8_ = 0x7f8000007f800000;
                      auVar152._12_4_ = 0x7f800000;
                      auVar152._16_4_ = 0x7f800000;
                      auVar152._20_4_ = 0x7f800000;
                      auVar152._24_4_ = 0x7f800000;
                      auVar152._28_4_ = 0x7f800000;
                      auVar98 = vblendmps_avx512vl(auVar152,auVar199._0_32_);
                      auVar134._0_4_ =
                           (uint)(bVar83 & 1) * auVar98._0_4_ |
                           (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                      bVar14 = (bool)(bVar83 >> 1 & 1);
                      auVar134._4_4_ = (uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar83 >> 2 & 1);
                      auVar134._8_4_ = (uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar83 >> 3 & 1);
                      auVar134._12_4_ = (uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar83 >> 4 & 1);
                      auVar134._16_4_ = (uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar83 >> 5 & 1);
                      auVar134._20_4_ = (uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar83 >> 6 & 1);
                      auVar134._24_4_ = (uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * 0x7f800000;
                      auVar134._28_4_ =
                           (uint)(bVar83 >> 7) * auVar98._28_4_ |
                           (uint)!(bool)(bVar83 >> 7) * 0x7f800000;
                      auVar98 = vshufps_avx(auVar134,auVar134,0xb1);
                      auVar98 = vminps_avx(auVar134,auVar98);
                      auVar96 = vshufpd_avx(auVar98,auVar98,5);
                      auVar98 = vminps_avx(auVar98,auVar96);
                      auVar96 = vpermpd_avx2(auVar98,0x4e);
                      auVar98 = vminps_avx(auVar98,auVar96);
                      uVar156 = vcmpps_avx512vl(auVar134,auVar98,0);
                      bVar71 = (byte)uVar156 & bVar83;
                      if (bVar71 != 0) {
                        bVar83 = bVar71;
                      }
                      uVar82 = 0;
                      for (uVar74 = (uint)bVar83; (uVar74 & 1) == 0;
                          uVar74 = uVar74 >> 1 | 0x80000000) {
                        uVar82 = uVar82 + 1;
                      }
                      uVar72 = (ulong)uVar82;
                    } while( true );
                  }
                  fVar162 = local_1e0[uVar72];
                  fVar143 = *(float *)(local_1c0 + uVar72 * 4);
                  fVar153 = 1.0 - fVar162;
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar153),auVar22);
                  auVar87 = ZEXT416((uint)(fVar162 * fVar153 * 4.0));
                  auVar88 = vfnmsub213ss_fma(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),auVar87);
                  auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),auVar87);
                  fVar153 = fVar153 * auVar91._0_4_ * 0.5;
                  fVar154 = auVar88._0_4_ * 0.5;
                  auVar192 = ZEXT464((uint)fVar154);
                  fVar155 = auVar87._0_4_ * 0.5;
                  fVar174 = fVar162 * fVar162 * 0.5;
                  auVar179._0_4_ = fVar174 * (float)local_4c0._0_4_;
                  auVar179._4_4_ = fVar174 * (float)local_4c0._4_4_;
                  auVar179._8_4_ = fVar174 * (float)uStack_4b8;
                  auVar179._12_4_ = fVar174 * uStack_4b8._4_4_;
                  auVar163._4_4_ = fVar155;
                  auVar163._0_4_ = fVar155;
                  auVar163._8_4_ = fVar155;
                  auVar163._12_4_ = fVar155;
                  auVar87 = vfmadd132ps_fma(auVar163,auVar179,local_4b0);
                  auVar180._4_4_ = fVar154;
                  auVar180._0_4_ = fVar154;
                  auVar180._8_4_ = fVar154;
                  auVar180._12_4_ = fVar154;
                  auVar87 = vfmadd132ps_fma(auVar180,auVar87,local_4a0);
                  auVar191 = ZEXT1664(auVar87);
                  auVar164._4_4_ = fVar153;
                  auVar164._0_4_ = fVar153;
                  auVar164._8_4_ = fVar153;
                  auVar164._12_4_ = fVar153;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar72 * 4);
                  auVar87 = vfmadd213ps_fma(auVar164,local_4d0,auVar87);
                  uVar156 = vmovlps_avx(auVar87);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar156;
                  fVar153 = (float)vextractps_avx(auVar87,2);
                  (ray->Ng).field_0.field_0.z = fVar153;
                  ray->u = fVar162;
                  ray->v = fVar143;
                  ray->primID = uVar80;
                  ray->geomID = uVar82;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                  prim = local_510;
                  pre = local_518;
                  pPVar79 = local_520;
                }
              }
            }
          }
        }
      }
LAB_01cb5bcd:
      if (8 < iVar77) {
        auVar98 = vpbroadcastd_avx512vl();
        auVar211 = ZEXT3264(auVar98);
        local_3e0._4_4_ = local_420._0_4_;
        local_3e0._0_4_ = local_420._0_4_;
        local_3e0._8_4_ = local_420._0_4_;
        local_3e0._12_4_ = local_420._0_4_;
        local_3e0._16_4_ = local_420._0_4_;
        local_3e0._20_4_ = local_420._0_4_;
        local_3e0._24_4_ = local_420._0_4_;
        local_3e0._28_4_ = local_420._0_4_;
        auVar149._8_4_ = 3;
        auVar149._0_8_ = 0x300000003;
        auVar149._12_4_ = 3;
        auVar149._16_4_ = 3;
        auVar149._20_4_ = 3;
        auVar149._24_4_ = 3;
        auVar149._28_4_ = 3;
        local_3c0 = vpermps_avx2(auVar149,local_3c0);
        local_400._4_4_ = 1.0 / (float)local_440._0_4_;
        local_400._0_4_ = local_400._4_4_;
        fStack_3f8 = (float)local_400._4_4_;
        fStack_3f4 = (float)local_400._4_4_;
        fStack_3f0 = (float)local_400._4_4_;
        fStack_3ec = (float)local_400._4_4_;
        fStack_3e8 = (float)local_400._4_4_;
        fStack_3e4 = (float)local_400._4_4_;
        lVar75 = 8;
        local_4d4 = iVar77;
        local_460 = auVar94;
LAB_01cb5c64:
        auVar98 = vpbroadcastd_avx512vl();
        auVar98 = vpor_avx2(auVar98,_DAT_01fe9900);
        uVar20 = vpcmpgtd_avx512vl(auVar211._0_32_,auVar98);
        auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar75 * 4 + lVar21);
        auVar96 = *(undefined1 (*) [32])(lVar21 + 0x21aefac + lVar75 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar21 + 0x21af430 + lVar75 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar21 + 0x21af8b4 + lVar75 * 4);
        auVar199._0_4_ = auVar107._0_4_ * (float)local_380._0_4_;
        auVar199._4_4_ = auVar107._4_4_ * (float)local_380._4_4_;
        auVar199._8_4_ = auVar107._8_4_ * fStack_378;
        auVar199._12_4_ = auVar107._12_4_ * fStack_374;
        auVar199._16_4_ = auVar107._16_4_ * fStack_370;
        auVar199._20_4_ = auVar107._20_4_ * fStack_36c;
        auVar199._28_36_ = auVar192._28_36_;
        auVar199._24_4_ = auVar107._24_4_ * fStack_368;
        auVar192._0_4_ = auVar107._0_4_ * (float)local_3a0._0_4_;
        auVar192._4_4_ = auVar107._4_4_ * (float)local_3a0._4_4_;
        auVar192._8_4_ = auVar107._8_4_ * fStack_398;
        auVar192._12_4_ = auVar107._12_4_ * fStack_394;
        auVar192._16_4_ = auVar107._16_4_ * fStack_390;
        auVar192._20_4_ = auVar107._20_4_ * fStack_38c;
        auVar192._28_36_ = auVar191._28_36_;
        auVar192._24_4_ = auVar107._24_4_ * fStack_388;
        auVar99 = vmulps_avx512vl(local_100,auVar107);
        auVar97 = vfmadd231ps_avx512vl(auVar199._0_32_,auVar108,local_340);
        auVar100 = vfmadd231ps_avx512vl(auVar192._0_32_,auVar108,local_360);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,local_300);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_320);
        auVar106 = vfmadd231ps_avx512vl(auVar99,auVar96,local_c0);
        auVar87 = vfmadd231ps_fma(auVar97,auVar98,local_2c0);
        auVar192 = ZEXT1664(auVar87);
        auVar88 = vfmadd231ps_fma(auVar100,auVar98,local_2e0);
        auVar191 = ZEXT1664(auVar88);
        auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar75 * 4 + lVar21);
        auVar97 = *(undefined1 (*) [32])(lVar21 + 0x21b13cc + lVar75 * 4);
        auVar95 = vfmadd231ps_avx512vl(auVar106,auVar98,local_a0);
        auVar100 = *(undefined1 (*) [32])(lVar21 + 0x21b1850 + lVar75 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar21 + 0x21b1cd4 + lVar75 * 4);
        auVar197._0_4_ = auVar106._0_4_ * (float)local_380._0_4_;
        auVar197._4_4_ = auVar106._4_4_ * (float)local_380._4_4_;
        auVar197._8_4_ = auVar106._8_4_ * fStack_378;
        auVar197._12_4_ = auVar106._12_4_ * fStack_374;
        auVar197._16_4_ = auVar106._16_4_ * fStack_370;
        auVar197._20_4_ = auVar106._20_4_ * fStack_36c;
        auVar197._28_36_ = auVar196._28_36_;
        auVar197._24_4_ = auVar106._24_4_ * fStack_368;
        auVar54._4_4_ = auVar106._4_4_ * (float)local_3a0._4_4_;
        auVar54._0_4_ = auVar106._0_4_ * (float)local_3a0._0_4_;
        auVar54._8_4_ = auVar106._8_4_ * fStack_398;
        auVar54._12_4_ = auVar106._12_4_ * fStack_394;
        auVar54._16_4_ = auVar106._16_4_ * fStack_390;
        auVar54._20_4_ = auVar106._20_4_ * fStack_38c;
        auVar54._24_4_ = auVar106._24_4_ * fStack_388;
        auVar54._28_4_ = uStack_384;
        auVar102 = vmulps_avx512vl(local_100,auVar106);
        auVar101 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar100,local_340);
        auVar103 = vfmadd231ps_avx512vl(auVar54,auVar100,local_360);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,local_e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_300);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar97,local_320);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_c0);
        auVar91 = vfmadd231ps_fma(auVar101,auVar99,local_2c0);
        auVar196 = ZEXT1664(auVar91);
        auVar6 = vfmadd231ps_fma(auVar103,auVar99,local_2e0);
        auVar103 = vfmadd231ps_avx512vl(auVar102,auVar99,local_a0);
        auVar104 = vmaxps_avx512vl(auVar95,auVar103);
        auVar102 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar87));
        auVar101 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar88));
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar88),auVar102);
        auVar94 = vmulps_avx512vl(ZEXT1632(auVar87),auVar101);
        auVar93 = vsubps_avx512vl(auVar93,auVar94);
        auVar94 = vmulps_avx512vl(auVar101,auVar101);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,auVar102);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        auVar104 = vmulps_avx512vl(auVar104,auVar94);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        uVar156 = vcmpps_avx512vl(auVar93,auVar104,2);
        bVar83 = (byte)uVar20 & (byte)uVar156;
        if (bVar83 != 0) {
          auVar106 = vmulps_avx512vl(local_180,auVar106);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar106);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_140,auVar100);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_460,auVar97);
          auVar107 = vmulps_avx512vl(local_180,auVar107);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar107);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar108);
          auVar97 = vfmadd213ps_avx512vl(auVar98,local_460,auVar96);
          auVar98 = *(undefined1 (*) [32])(lVar21 + 0x21afd38 + lVar75 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar21 + 0x21b01bc + lVar75 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar21 + 0x21b0640 + lVar75 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar21 + 0x21b0ac4 + lVar75 * 4);
          auVar100 = vmulps_avx512vl(_local_380,auVar107);
          auVar106 = vmulps_avx512vl(_local_3a0,auVar107);
          auVar107 = vmulps_avx512vl(local_180,auVar107);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,local_340);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_360);
          auVar108 = vfmadd231ps_avx512vl(auVar107,local_160,auVar108);
          auVar107 = vfmadd231ps_avx512vl(auVar100,auVar96,local_300);
          auVar100 = vfmadd231ps_avx512vl(auVar106,auVar96,local_320);
          auVar96 = vfmadd231ps_avx512vl(auVar108,local_140,auVar96);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,local_2c0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_2e0);
          auVar7 = vfmadd231ps_fma(auVar96,auVar98,local_460);
          auVar98 = *(undefined1 (*) [32])(lVar21 + 0x21b2158 + lVar75 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar21 + 0x21b2a60 + lVar75 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar21 + 0x21b2ee4 + lVar75 * 4);
          auVar106 = vmulps_avx512vl(_local_380,auVar108);
          auVar104 = vmulps_avx512vl(_local_3a0,auVar108);
          auVar108 = vmulps_avx512vl(local_180,auVar108);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,local_340);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_360);
          auVar108 = vfmadd231ps_avx512vl(auVar108,local_160,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar21 + 0x21b25dc + lVar75 * 4);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,local_300);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_320);
          auVar96 = vfmadd231ps_avx512vl(auVar108,local_140,auVar96);
          auVar108 = vfmadd231ps_avx512vl(auVar106,auVar98,local_2c0);
          auVar106 = vfmadd231ps_avx512vl(auVar104,auVar98,local_2e0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_460,auVar98);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar107,auVar104);
          vandps_avx512vl(auVar100,auVar104);
          auVar98 = vmaxps_avx(auVar104,auVar104);
          vandps_avx512vl(ZEXT1632(auVar7),auVar104);
          auVar98 = vmaxps_avx(auVar98,auVar104);
          uVar72 = vcmpps_avx512vl(auVar98,local_3e0,1);
          bVar14 = (bool)((byte)uVar72 & 1);
          auVar122._0_4_ = (float)((uint)bVar14 * auVar102._0_4_ | (uint)!bVar14 * auVar107._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar14 * auVar102._4_4_ | (uint)!bVar14 * auVar107._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * auVar107._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar122._12_4_ =
               (float)((uint)bVar14 * auVar102._12_4_ | (uint)!bVar14 * auVar107._12_4_);
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar122._16_4_ =
               (float)((uint)bVar14 * auVar102._16_4_ | (uint)!bVar14 * auVar107._16_4_);
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar122._20_4_ =
               (float)((uint)bVar14 * auVar102._20_4_ | (uint)!bVar14 * auVar107._20_4_);
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar122._24_4_ =
               (float)((uint)bVar14 * auVar102._24_4_ | (uint)!bVar14 * auVar107._24_4_);
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar122._28_4_ = (uint)bVar14 * auVar102._28_4_ | (uint)!bVar14 * auVar107._28_4_;
          bVar14 = (bool)((byte)uVar72 & 1);
          auVar123._0_4_ = (float)((uint)bVar14 * auVar101._0_4_ | (uint)!bVar14 * auVar100._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar14 * auVar101._4_4_ | (uint)!bVar14 * auVar100._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar14 * auVar101._8_4_ | (uint)!bVar14 * auVar100._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar14 * auVar101._12_4_ | (uint)!bVar14 * auVar100._12_4_);
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar123._16_4_ =
               (float)((uint)bVar14 * auVar101._16_4_ | (uint)!bVar14 * auVar100._16_4_);
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar123._20_4_ =
               (float)((uint)bVar14 * auVar101._20_4_ | (uint)!bVar14 * auVar100._20_4_);
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar123._24_4_ =
               (float)((uint)bVar14 * auVar101._24_4_ | (uint)!bVar14 * auVar100._24_4_);
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar123._28_4_ = (uint)bVar14 * auVar101._28_4_ | (uint)!bVar14 * auVar100._28_4_;
          vandps_avx512vl(auVar108,auVar104);
          vandps_avx512vl(auVar106,auVar104);
          auVar98 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar96,auVar104);
          auVar98 = vmaxps_avx(auVar98,auVar123);
          uVar72 = vcmpps_avx512vl(auVar98,local_3e0,1);
          bVar14 = (bool)((byte)uVar72 & 1);
          auVar124._0_4_ = (uint)bVar14 * auVar102._0_4_ | (uint)!bVar14 * auVar108._0_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar14 * auVar102._4_4_ | (uint)!bVar14 * auVar108._4_4_;
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * auVar108._8_4_;
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar14 * auVar102._12_4_ | (uint)!bVar14 * auVar108._12_4_;
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar14 * auVar102._16_4_ | (uint)!bVar14 * auVar108._16_4_;
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar14 * auVar102._20_4_ | (uint)!bVar14 * auVar108._20_4_;
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar14 * auVar102._24_4_ | (uint)!bVar14 * auVar108._24_4_;
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar124._28_4_ = (uint)bVar14 * auVar102._28_4_ | (uint)!bVar14 * auVar108._28_4_;
          bVar14 = (bool)((byte)uVar72 & 1);
          auVar125._0_4_ = (float)((uint)bVar14 * auVar101._0_4_ | (uint)!bVar14 * auVar106._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar14 * auVar101._4_4_ | (uint)!bVar14 * auVar106._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar14 * auVar101._8_4_ | (uint)!bVar14 * auVar106._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar14 * auVar101._12_4_ | (uint)!bVar14 * auVar106._12_4_);
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar14 * auVar101._16_4_ | (uint)!bVar14 * auVar106._16_4_);
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar14 * auVar101._20_4_ | (uint)!bVar14 * auVar106._20_4_);
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar14 * auVar101._24_4_ | (uint)!bVar14 * auVar106._24_4_);
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar125._28_4_ = (uint)bVar14 * auVar101._28_4_ | (uint)!bVar14 * auVar106._28_4_;
          auVar201._8_4_ = 0x80000000;
          auVar201._0_8_ = 0x8000000080000000;
          auVar201._12_4_ = 0x80000000;
          auVar201._16_4_ = 0x80000000;
          auVar201._20_4_ = 0x80000000;
          auVar201._24_4_ = 0x80000000;
          auVar201._28_4_ = 0x80000000;
          auVar98 = vxorps_avx512vl(auVar124,auVar201);
          auVar92 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
          auVar96 = vfmadd213ps_avx512vl(auVar122,auVar122,ZEXT1632(auVar92));
          auVar7 = vfmadd231ps_fma(auVar96,auVar123,auVar123);
          auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar210._8_4_ = 0xbf000000;
          auVar210._0_8_ = 0xbf000000bf000000;
          auVar210._12_4_ = 0xbf000000;
          auVar210._16_4_ = 0xbf000000;
          auVar210._20_4_ = 0xbf000000;
          auVar210._24_4_ = 0xbf000000;
          auVar210._28_4_ = 0xbf000000;
          fVar162 = auVar96._0_4_;
          fVar143 = auVar96._4_4_;
          fVar153 = auVar96._8_4_;
          fVar154 = auVar96._12_4_;
          fVar155 = auVar96._16_4_;
          fVar174 = auVar96._20_4_;
          fVar85 = auVar96._24_4_;
          auVar55._4_4_ = fVar143 * fVar143 * fVar143 * auVar7._4_4_ * -0.5;
          auVar55._0_4_ = fVar162 * fVar162 * fVar162 * auVar7._0_4_ * -0.5;
          auVar55._8_4_ = fVar153 * fVar153 * fVar153 * auVar7._8_4_ * -0.5;
          auVar55._12_4_ = fVar154 * fVar154 * fVar154 * auVar7._12_4_ * -0.5;
          auVar55._16_4_ = fVar155 * fVar155 * fVar155 * -0.0;
          auVar55._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar55._24_4_ = fVar85 * fVar85 * fVar85 * -0.0;
          auVar55._28_4_ = auVar123._28_4_;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar96 = vfmadd231ps_avx512vl(auVar55,auVar108,auVar96);
          auVar56._4_4_ = auVar123._4_4_ * auVar96._4_4_;
          auVar56._0_4_ = auVar123._0_4_ * auVar96._0_4_;
          auVar56._8_4_ = auVar123._8_4_ * auVar96._8_4_;
          auVar56._12_4_ = auVar123._12_4_ * auVar96._12_4_;
          auVar56._16_4_ = auVar123._16_4_ * auVar96._16_4_;
          auVar56._20_4_ = auVar123._20_4_ * auVar96._20_4_;
          auVar56._24_4_ = auVar123._24_4_ * auVar96._24_4_;
          auVar56._28_4_ = 0;
          auVar57._4_4_ = auVar96._4_4_ * -auVar122._4_4_;
          auVar57._0_4_ = auVar96._0_4_ * -auVar122._0_4_;
          auVar57._8_4_ = auVar96._8_4_ * -auVar122._8_4_;
          auVar57._12_4_ = auVar96._12_4_ * -auVar122._12_4_;
          auVar57._16_4_ = auVar96._16_4_ * -auVar122._16_4_;
          auVar57._20_4_ = auVar96._20_4_ * -auVar122._20_4_;
          auVar57._24_4_ = auVar96._24_4_ * -auVar122._24_4_;
          auVar57._28_4_ = auVar123._28_4_;
          auVar107 = vmulps_avx512vl(auVar96,ZEXT1632(auVar92));
          auVar106 = ZEXT1632(auVar92);
          auVar96 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar106);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar125,auVar125);
          auVar100 = vrsqrt14ps_avx512vl(auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar210);
          fVar162 = auVar100._0_4_;
          fVar143 = auVar100._4_4_;
          fVar153 = auVar100._8_4_;
          fVar154 = auVar100._12_4_;
          fVar155 = auVar100._16_4_;
          fVar174 = auVar100._20_4_;
          fVar85 = auVar100._24_4_;
          auVar58._4_4_ = fVar143 * fVar143 * fVar143 * auVar96._4_4_;
          auVar58._0_4_ = fVar162 * fVar162 * fVar162 * auVar96._0_4_;
          auVar58._8_4_ = fVar153 * fVar153 * fVar153 * auVar96._8_4_;
          auVar58._12_4_ = fVar154 * fVar154 * fVar154 * auVar96._12_4_;
          auVar58._16_4_ = fVar155 * fVar155 * fVar155 * auVar96._16_4_;
          auVar58._20_4_ = fVar174 * fVar174 * fVar174 * auVar96._20_4_;
          auVar58._24_4_ = fVar85 * fVar85 * fVar85 * auVar96._24_4_;
          auVar58._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar58,auVar108,auVar100);
          auVar59._4_4_ = auVar125._4_4_ * auVar96._4_4_;
          auVar59._0_4_ = auVar125._0_4_ * auVar96._0_4_;
          auVar59._8_4_ = auVar125._8_4_ * auVar96._8_4_;
          auVar59._12_4_ = auVar125._12_4_ * auVar96._12_4_;
          auVar59._16_4_ = auVar125._16_4_ * auVar96._16_4_;
          auVar59._20_4_ = auVar125._20_4_ * auVar96._20_4_;
          auVar59._24_4_ = auVar125._24_4_ * auVar96._24_4_;
          auVar59._28_4_ = auVar100._28_4_;
          auVar60._4_4_ = auVar96._4_4_ * auVar98._4_4_;
          auVar60._0_4_ = auVar96._0_4_ * auVar98._0_4_;
          auVar60._8_4_ = auVar96._8_4_ * auVar98._8_4_;
          auVar60._12_4_ = auVar96._12_4_ * auVar98._12_4_;
          auVar60._16_4_ = auVar96._16_4_ * auVar98._16_4_;
          auVar60._20_4_ = auVar96._20_4_ * auVar98._20_4_;
          auVar60._24_4_ = auVar96._24_4_ * auVar98._24_4_;
          auVar60._28_4_ = auVar98._28_4_;
          auVar98 = vmulps_avx512vl(auVar96,auVar106);
          auVar7 = vfmadd213ps_fma(auVar56,auVar95,ZEXT1632(auVar87));
          auVar8 = vfmadd213ps_fma(auVar57,auVar95,ZEXT1632(auVar88));
          auVar108 = vfmadd213ps_avx512vl(auVar107,auVar95,auVar97);
          auVar100 = vfmadd213ps_avx512vl(auVar59,auVar103,ZEXT1632(auVar91));
          auVar10 = vfnmadd213ps_fma(auVar56,auVar95,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar60,auVar103,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar57,auVar95,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar98,auVar103,auVar99);
          auVar159 = vfnmadd231ps_fma(auVar97,auVar95,auVar107);
          auVar157 = vfnmadd213ps_fma(auVar59,auVar103,ZEXT1632(auVar91));
          auVar158 = vfnmadd213ps_fma(auVar60,auVar103,ZEXT1632(auVar6));
          auVar89 = vfnmadd231ps_fma(auVar99,auVar103,auVar98);
          auVar99 = vsubps_avx512vl(auVar100,ZEXT1632(auVar10));
          auVar98 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar11));
          auVar96 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar159));
          auVar61._4_4_ = auVar98._4_4_ * auVar159._4_4_;
          auVar61._0_4_ = auVar98._0_4_ * auVar159._0_4_;
          auVar61._8_4_ = auVar98._8_4_ * auVar159._8_4_;
          auVar61._12_4_ = auVar98._12_4_ * auVar159._12_4_;
          auVar61._16_4_ = auVar98._16_4_ * 0.0;
          auVar61._20_4_ = auVar98._20_4_ * 0.0;
          auVar61._24_4_ = auVar98._24_4_ * 0.0;
          auVar61._28_4_ = auVar107._28_4_;
          auVar91 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar11),auVar96);
          auVar62._4_4_ = auVar96._4_4_ * auVar10._4_4_;
          auVar62._0_4_ = auVar96._0_4_ * auVar10._0_4_;
          auVar62._8_4_ = auVar96._8_4_ * auVar10._8_4_;
          auVar62._12_4_ = auVar96._12_4_ * auVar10._12_4_;
          auVar62._16_4_ = auVar96._16_4_ * 0.0;
          auVar62._20_4_ = auVar96._20_4_ * 0.0;
          auVar62._24_4_ = auVar96._24_4_ * 0.0;
          auVar62._28_4_ = auVar96._28_4_;
          auVar6 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar159),auVar99);
          auVar63._4_4_ = auVar11._4_4_ * auVar99._4_4_;
          auVar63._0_4_ = auVar11._0_4_ * auVar99._0_4_;
          auVar63._8_4_ = auVar11._8_4_ * auVar99._8_4_;
          auVar63._12_4_ = auVar11._12_4_ * auVar99._12_4_;
          auVar63._16_4_ = auVar99._16_4_ * 0.0;
          auVar63._20_4_ = auVar99._20_4_ * 0.0;
          auVar63._24_4_ = auVar99._24_4_ * 0.0;
          auVar63._28_4_ = auVar99._28_4_;
          auVar9 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar10),auVar98);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar106,ZEXT1632(auVar6));
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar106,ZEXT1632(auVar91));
          auVar93 = ZEXT1632(auVar92);
          uVar72 = vcmpps_avx512vl(auVar98,auVar93,2);
          bVar71 = (byte)uVar72;
          fVar135 = (float)((uint)(bVar71 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar157._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar137 = (float)((uint)bVar14 * auVar7._4_4_ | (uint)!bVar14 * auVar157._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar140 = (float)((uint)bVar14 * auVar7._8_4_ | (uint)!bVar14 * auVar157._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar141 = (float)((uint)bVar14 * auVar7._12_4_ | (uint)!bVar14 * auVar157._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar140,CONCAT44(fVar137,fVar135))));
          fVar136 = (float)((uint)(bVar71 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar158._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar139 = (float)((uint)bVar14 * auVar8._4_4_ | (uint)!bVar14 * auVar158._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar138 = (float)((uint)bVar14 * auVar8._8_4_ | (uint)!bVar14 * auVar158._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar142 = (float)((uint)bVar14 * auVar8._12_4_ | (uint)!bVar14 * auVar158._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar138,CONCAT44(fVar139,fVar136))));
          auVar126._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar89._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar89._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar89._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar89._12_4_)
          ;
          fVar143 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar108._16_4_);
          auVar126._16_4_ = fVar143;
          fVar162 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar108._20_4_);
          auVar126._20_4_ = fVar162;
          fVar153 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar108._24_4_);
          auVar126._24_4_ = fVar153;
          iVar1 = (uint)(byte)(uVar72 >> 7) * auVar108._28_4_;
          auVar126._28_4_ = iVar1;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar100);
          auVar127._0_4_ =
               (uint)(bVar71 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar91._0_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar91._4_4_;
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar91._8_4_;
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar91._12_4_;
          auVar127._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar98._16_4_;
          auVar127._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar98._20_4_;
          auVar127._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar98._24_4_;
          auVar127._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar98._28_4_;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar87));
          auVar128._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar7._0_4_
                      );
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar7._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar7._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar7._12_4_);
          fVar174 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar98._16_4_);
          auVar128._16_4_ = fVar174;
          fVar155 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar98._20_4_);
          auVar128._20_4_ = fVar155;
          fVar154 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar98._24_4_);
          auVar128._24_4_ = fVar154;
          auVar128._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar98._28_4_;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar159),ZEXT1632(auVar88));
          auVar129._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar8._0_4_
                      );
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar8._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar8._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar8._12_4_);
          fVar175 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar98._16_4_);
          auVar129._16_4_ = fVar175;
          fVar85 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar98._20_4_);
          auVar129._20_4_ = fVar85;
          fVar86 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar98._24_4_);
          auVar129._24_4_ = fVar86;
          iVar2 = (uint)(byte)(uVar72 >> 7) * auVar98._28_4_;
          auVar129._28_4_ = iVar2;
          auVar130._0_4_ =
               (uint)(bVar71 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar100._0_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar14 * (int)auVar10._4_4_ | (uint)!bVar14 * auVar100._4_4_;
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar14 * (int)auVar10._8_4_ | (uint)!bVar14 * auVar100._8_4_;
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar14 * (int)auVar10._12_4_ | (uint)!bVar14 * auVar100._12_4_;
          auVar130._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar100._16_4_;
          auVar130._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar100._20_4_;
          auVar130._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar100._24_4_;
          auVar130._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar100._28_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar100 = vsubps_avx512vl(auVar130,auVar106);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar11._12_4_ |
                                                  (uint)!bVar18 * auVar87._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar11._8_4_ |
                                                           (uint)!bVar16 * auVar87._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar11._4_4_ |
                                                                    (uint)!bVar14 * auVar87._4_4_,
                                                                    (uint)(bVar71 & 1) *
                                                                    (int)auVar11._0_4_ |
                                                                    (uint)!(bool)(bVar71 & 1) *
                                                                    auVar87._0_4_)))),auVar102);
          auVar192 = ZEXT3264(auVar96);
          auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar159._12_4_ |
                                                   (uint)!bVar19 * auVar88._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar159._8_4_ |
                                                            (uint)!bVar17 * auVar88._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar159._4_4_ |
                                                                     (uint)!bVar15 * auVar88._4_4_,
                                                                     (uint)(bVar71 & 1) *
                                                                     (int)auVar159._0_4_ |
                                                                     (uint)!(bool)(bVar71 & 1) *
                                                                     auVar88._0_4_)))),auVar126);
          auVar107 = vsubps_avx(auVar106,auVar127);
          auVar196 = ZEXT3264(auVar107);
          auVar99 = vsubps_avx(auVar102,auVar128);
          auVar97 = vsubps_avx(auVar126,auVar129);
          auVar64._4_4_ = auVar108._4_4_ * fVar137;
          auVar64._0_4_ = auVar108._0_4_ * fVar135;
          auVar64._8_4_ = auVar108._8_4_ * fVar140;
          auVar64._12_4_ = auVar108._12_4_ * fVar141;
          auVar64._16_4_ = auVar108._16_4_ * 0.0;
          auVar64._20_4_ = auVar108._20_4_ * 0.0;
          auVar64._24_4_ = auVar108._24_4_ * 0.0;
          auVar64._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar64,auVar126,auVar100);
          auVar177._0_4_ = fVar136 * auVar100._0_4_;
          auVar177._4_4_ = fVar139 * auVar100._4_4_;
          auVar177._8_4_ = fVar138 * auVar100._8_4_;
          auVar177._12_4_ = fVar142 * auVar100._12_4_;
          auVar177._16_4_ = auVar100._16_4_ * 0.0;
          auVar177._20_4_ = auVar100._20_4_ * 0.0;
          auVar177._24_4_ = auVar100._24_4_ * 0.0;
          auVar177._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar177,auVar106,auVar96);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar93,ZEXT1632(auVar87));
          auVar189._0_4_ = auVar96._0_4_ * auVar126._0_4_;
          auVar189._4_4_ = auVar96._4_4_ * auVar126._4_4_;
          auVar189._8_4_ = auVar96._8_4_ * auVar126._8_4_;
          auVar189._12_4_ = auVar96._12_4_ * auVar126._12_4_;
          auVar189._16_4_ = auVar96._16_4_ * fVar143;
          auVar189._20_4_ = auVar96._20_4_ * fVar162;
          auVar189._24_4_ = auVar96._24_4_ * fVar153;
          auVar189._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar189,auVar102,auVar108);
          auVar101 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar87));
          auVar98 = vmulps_avx512vl(auVar97,auVar127);
          auVar98 = vfmsub231ps_avx512vl(auVar98,auVar107,auVar129);
          auVar65._4_4_ = auVar99._4_4_ * auVar129._4_4_;
          auVar65._0_4_ = auVar99._0_4_ * auVar129._0_4_;
          auVar65._8_4_ = auVar99._8_4_ * auVar129._8_4_;
          auVar65._12_4_ = auVar99._12_4_ * auVar129._12_4_;
          auVar65._16_4_ = auVar99._16_4_ * fVar175;
          auVar65._20_4_ = auVar99._20_4_ * fVar85;
          auVar65._24_4_ = auVar99._24_4_ * fVar86;
          auVar65._28_4_ = iVar2;
          auVar87 = vfmsub231ps_fma(auVar65,auVar128,auVar97);
          auVar190._0_4_ = auVar128._0_4_ * auVar107._0_4_;
          auVar190._4_4_ = auVar128._4_4_ * auVar107._4_4_;
          auVar190._8_4_ = auVar128._8_4_ * auVar107._8_4_;
          auVar190._12_4_ = auVar128._12_4_ * auVar107._12_4_;
          auVar190._16_4_ = fVar174 * auVar107._16_4_;
          auVar190._20_4_ = fVar155 * auVar107._20_4_;
          auVar190._24_4_ = fVar154 * auVar107._24_4_;
          auVar190._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar190,auVar99,auVar127);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar93,auVar98);
          auVar104 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar87));
          auVar191 = ZEXT3264(auVar104);
          auVar98 = vmaxps_avx(auVar101,auVar104);
          uVar156 = vcmpps_avx512vl(auVar98,auVar93,2);
          bVar83 = bVar83 & (byte)uVar156;
          if (bVar83 != 0) {
            auVar66._4_4_ = auVar97._4_4_ * auVar96._4_4_;
            auVar66._0_4_ = auVar97._0_4_ * auVar96._0_4_;
            auVar66._8_4_ = auVar97._8_4_ * auVar96._8_4_;
            auVar66._12_4_ = auVar97._12_4_ * auVar96._12_4_;
            auVar66._16_4_ = auVar97._16_4_ * auVar96._16_4_;
            auVar66._20_4_ = auVar97._20_4_ * auVar96._20_4_;
            auVar66._24_4_ = auVar97._24_4_ * auVar96._24_4_;
            auVar66._28_4_ = auVar98._28_4_;
            auVar6 = vfmsub231ps_fma(auVar66,auVar99,auVar108);
            auVar67._4_4_ = auVar108._4_4_ * auVar107._4_4_;
            auVar67._0_4_ = auVar108._0_4_ * auVar107._0_4_;
            auVar67._8_4_ = auVar108._8_4_ * auVar107._8_4_;
            auVar67._12_4_ = auVar108._12_4_ * auVar107._12_4_;
            auVar67._16_4_ = auVar108._16_4_ * auVar107._16_4_;
            auVar67._20_4_ = auVar108._20_4_ * auVar107._20_4_;
            auVar67._24_4_ = auVar108._24_4_ * auVar107._24_4_;
            auVar67._28_4_ = auVar108._28_4_;
            auVar91 = vfmsub231ps_fma(auVar67,auVar100,auVar97);
            auVar68._4_4_ = auVar99._4_4_ * auVar100._4_4_;
            auVar68._0_4_ = auVar99._0_4_ * auVar100._0_4_;
            auVar68._8_4_ = auVar99._8_4_ * auVar100._8_4_;
            auVar68._12_4_ = auVar99._12_4_ * auVar100._12_4_;
            auVar68._16_4_ = auVar99._16_4_ * auVar100._16_4_;
            auVar68._20_4_ = auVar99._20_4_ * auVar100._20_4_;
            auVar68._24_4_ = auVar99._24_4_ * auVar100._24_4_;
            auVar68._28_4_ = auVar99._28_4_;
            auVar7 = vfmsub231ps_fma(auVar68,auVar107,auVar96);
            auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar7));
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT1632(auVar6),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar98 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
            auVar196 = ZEXT3264(auVar98);
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar96 = vfnmadd213ps_avx512vl(auVar98,ZEXT1632(auVar88),auVar31);
            auVar87 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
            auVar192 = ZEXT1664(auVar87);
            auVar69._4_4_ = auVar7._4_4_ * auVar126._4_4_;
            auVar69._0_4_ = auVar7._0_4_ * auVar126._0_4_;
            auVar69._8_4_ = auVar7._8_4_ * auVar126._8_4_;
            auVar69._12_4_ = auVar7._12_4_ * auVar126._12_4_;
            auVar69._16_4_ = fVar143 * 0.0;
            auVar69._20_4_ = fVar162 * 0.0;
            auVar69._24_4_ = fVar153 * 0.0;
            auVar69._28_4_ = iVar1;
            auVar91 = vfmadd231ps_fma(auVar69,auVar102,ZEXT1632(auVar91));
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar106,ZEXT1632(auVar6));
            fVar143 = auVar87._0_4_;
            fVar153 = auVar87._4_4_;
            fVar154 = auVar87._8_4_;
            fVar155 = auVar87._12_4_;
            local_260 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar155,
                                           CONCAT48(auVar91._8_4_ * fVar154,
                                                    CONCAT44(auVar91._4_4_ * fVar153,
                                                             auVar91._0_4_ * fVar143))));
            auVar199 = ZEXT3264(local_260);
            uVar156 = vcmpps_avx512vl(local_260,local_3c0,0xd);
            fVar162 = (ray->super_RayK<1>).tfar;
            auVar32._4_4_ = fVar162;
            auVar32._0_4_ = fVar162;
            auVar32._8_4_ = fVar162;
            auVar32._12_4_ = fVar162;
            auVar32._16_4_ = fVar162;
            auVar32._20_4_ = fVar162;
            auVar32._24_4_ = fVar162;
            auVar32._28_4_ = fVar162;
            uVar20 = vcmpps_avx512vl(local_260,auVar32,2);
            bVar83 = (byte)uVar156 & (byte)uVar20 & bVar83;
            if (bVar83 != 0) {
              uVar84 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar84 = bVar83 & uVar84;
              if ((char)uVar84 != '\0') {
                fVar162 = auVar101._0_4_ * fVar143;
                fVar174 = auVar101._4_4_ * fVar153;
                auVar70._4_4_ = fVar174;
                auVar70._0_4_ = fVar162;
                fVar85 = auVar101._8_4_ * fVar154;
                auVar70._8_4_ = fVar85;
                fVar86 = auVar101._12_4_ * fVar155;
                auVar70._12_4_ = fVar86;
                fVar175 = auVar101._16_4_ * 0.0;
                auVar70._16_4_ = fVar175;
                fVar135 = auVar101._20_4_ * 0.0;
                auVar70._20_4_ = fVar135;
                fVar136 = auVar101._24_4_ * 0.0;
                auVar70._24_4_ = fVar136;
                auVar70._28_4_ = auVar101._28_4_;
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = 0x3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar98 = vsubps_avx(auVar173,auVar70);
                local_2a0._0_4_ =
                     (float)((uint)(bVar71 & 1) * (int)fVar162 |
                            (uint)!(bool)(bVar71 & 1) * auVar98._0_4_);
                bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
                local_2a0._4_4_ =
                     (float)((uint)bVar14 * (int)fVar174 | (uint)!bVar14 * auVar98._4_4_);
                bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                local_2a0._8_4_ =
                     (float)((uint)bVar14 * (int)fVar85 | (uint)!bVar14 * auVar98._8_4_);
                bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
                local_2a0._12_4_ =
                     (float)((uint)bVar14 * (int)fVar86 | (uint)!bVar14 * auVar98._12_4_);
                bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                local_2a0._16_4_ =
                     (float)((uint)bVar14 * (int)fVar175 | (uint)!bVar14 * auVar98._16_4_);
                bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
                local_2a0._20_4_ =
                     (float)((uint)bVar14 * (int)fVar135 | (uint)!bVar14 * auVar98._20_4_);
                bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
                local_2a0._24_4_ =
                     (float)((uint)bVar14 * (int)fVar136 | (uint)!bVar14 * auVar98._24_4_);
                bVar14 = SUB81(uVar72 >> 7,0);
                local_2a0._28_4_ =
                     (float)((uint)bVar14 * auVar101._28_4_ | (uint)!bVar14 * auVar98._28_4_);
                auVar98 = vsubps_avx(auVar103,auVar95);
                auVar87 = vfmadd213ps_fma(auVar98,local_2a0,auVar95);
                fVar162 = pre->depth_scale;
                auVar33._4_4_ = fVar162;
                auVar33._0_4_ = fVar162;
                auVar33._8_4_ = fVar162;
                auVar33._12_4_ = fVar162;
                auVar33._16_4_ = fVar162;
                auVar33._20_4_ = fVar162;
                auVar33._24_4_ = fVar162;
                auVar33._28_4_ = fVar162;
                auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                             CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                      CONCAT44(auVar87._4_4_ +
                                                                               auVar87._4_4_,
                                                                               auVar87._0_4_ +
                                                                               auVar87._0_4_)))),
                                          auVar33);
                uVar78 = vcmpps_avx512vl(local_260,auVar98,6);
                uVar84 = uVar84 & uVar78;
                uVar82 = (uint)uVar84;
                bVar83 = (byte)uVar84;
                if (bVar83 != 0) {
                  auVar161._0_4_ = auVar104._0_4_ * fVar143;
                  auVar161._4_4_ = auVar104._4_4_ * fVar153;
                  auVar161._8_4_ = auVar104._8_4_ * fVar154;
                  auVar161._12_4_ = auVar104._12_4_ * fVar155;
                  auVar161._16_4_ = auVar104._16_4_ * 0.0;
                  auVar161._20_4_ = auVar104._20_4_ * 0.0;
                  auVar161._24_4_ = auVar104._24_4_ * 0.0;
                  auVar161._28_4_ = 0;
                  auVar178._8_4_ = 0x3f800000;
                  auVar178._0_8_ = 0x3f8000003f800000;
                  auVar178._12_4_ = 0x3f800000;
                  auVar178._16_4_ = 0x3f800000;
                  auVar178._20_4_ = 0x3f800000;
                  auVar178._24_4_ = 0x3f800000;
                  auVar178._28_4_ = 0x3f800000;
                  auVar98 = vsubps_avx(auVar178,auVar161);
                  auVar131._0_4_ =
                       (uint)(bVar71 & 1) * (int)auVar161._0_4_ |
                       (uint)!(bool)(bVar71 & 1) * auVar98._0_4_;
                  bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
                  auVar131._4_4_ =
                       (uint)bVar14 * (int)auVar161._4_4_ | (uint)!bVar14 * auVar98._4_4_;
                  bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                  auVar131._8_4_ =
                       (uint)bVar14 * (int)auVar161._8_4_ | (uint)!bVar14 * auVar98._8_4_;
                  bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar14 * (int)auVar161._12_4_ | (uint)!bVar14 * auVar98._12_4_;
                  bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                  auVar131._16_4_ =
                       (uint)bVar14 * (int)auVar161._16_4_ | (uint)!bVar14 * auVar98._16_4_;
                  bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
                  auVar131._20_4_ =
                       (uint)bVar14 * (int)auVar161._20_4_ | (uint)!bVar14 * auVar98._20_4_;
                  bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
                  auVar131._24_4_ =
                       (uint)bVar14 * (int)auVar161._24_4_ | (uint)!bVar14 * auVar98._24_4_;
                  auVar131._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar98._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_280 = vfmsub132ps_avx512vl(auVar131,auVar178,auVar34);
                  local_240 = (int)lVar75;
                  local_23c = iVar77;
                  auVar196 = ZEXT1664(local_4d0);
                  local_230 = local_4d0;
                  local_220 = local_4a0._0_8_;
                  uStack_218 = local_4a0._8_8_;
                  local_210 = local_4b0._0_8_;
                  uStack_208 = local_4b0._8_8_;
                  local_200 = local_4c0;
                  uStack_1f8 = uStack_4b8;
                  pGVar76 = (context->scene->geometries).items[local_538].ptr;
                  iVar77 = local_4d4;
                  if ((pGVar76->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar87 = vcvtsi2ss_avx512f(auVar92,(int)lVar75);
                    fVar162 = auVar87._0_4_;
                    local_1e0[0] = (fVar162 + local_2a0._0_4_ + 0.0) * (float)local_400._0_4_;
                    local_1e0[1] = (fVar162 + local_2a0._4_4_ + 1.0) * (float)local_400._4_4_;
                    local_1e0[2] = (fVar162 + local_2a0._8_4_ + 2.0) * fStack_3f8;
                    local_1e0[3] = (fVar162 + local_2a0._12_4_ + 3.0) * fStack_3f4;
                    fStack_1d0 = (fVar162 + local_2a0._16_4_ + 4.0) * fStack_3f0;
                    fStack_1cc = (fVar162 + local_2a0._20_4_ + 5.0) * fStack_3ec;
                    fStack_1c8 = (fVar162 + local_2a0._24_4_ + 6.0) * fStack_3e8;
                    fStack_1c4 = fVar162 + local_2a0._28_4_ + 7.0;
                    local_1c0 = local_280;
                    local_1a0 = local_260;
                    auVar150._8_4_ = 0x7f800000;
                    auVar150._0_8_ = 0x7f8000007f800000;
                    auVar150._12_4_ = 0x7f800000;
                    auVar150._16_4_ = 0x7f800000;
                    auVar150._20_4_ = 0x7f800000;
                    auVar150._24_4_ = 0x7f800000;
                    auVar150._28_4_ = 0x7f800000;
                    auVar98 = vblendmps_avx512vl(auVar150,local_260);
                    auVar132._0_4_ =
                         (uint)(bVar83 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000
                    ;
                    bVar14 = (bool)((byte)(uVar84 >> 1) & 1);
                    auVar132._4_4_ = (uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                    auVar132._8_4_ = (uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar84 >> 3) & 1);
                    auVar132._12_4_ = (uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                    auVar132._16_4_ = (uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar84 >> 5) & 1);
                    auVar132._20_4_ = (uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar84 >> 6) & 1);
                    auVar132._24_4_ = (uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar84 >> 7,0);
                    auVar132._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar98 = vshufps_avx(auVar132,auVar132,0xb1);
                    auVar98 = vminps_avx(auVar132,auVar98);
                    auVar96 = vshufpd_avx(auVar98,auVar98,5);
                    auVar98 = vminps_avx(auVar98,auVar96);
                    auVar96 = vpermpd_avx2(auVar98,0x4e);
                    auVar98 = vminps_avx(auVar98,auVar96);
                    uVar156 = vcmpps_avx512vl(auVar132,auVar98,0);
                    local_4d8 = uVar82;
                    uVar74 = uVar82;
                    if (((byte)uVar156 & bVar83) != 0) {
                      uVar74 = (uint)((byte)uVar156 & bVar83);
                    }
                    uVar73 = 0;
                    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar72 = (ulong)uVar73;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_420 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_120 = vmovdqa64_avx512vl(auVar211._0_32_);
                      local_440 = local_260;
                      local_540 = pGVar76;
                      do {
                        local_484 = local_1e0[uVar72];
                        local_480 = *(undefined4 *)(local_1c0 + uVar72 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar72 * 4);
                        local_508.context = context->user;
                        fVar162 = 1.0 - local_484;
                        auVar24._8_4_ = 0x80000000;
                        auVar24._0_8_ = 0x8000000080000000;
                        auVar24._12_4_ = 0x80000000;
                        auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar162),auVar24);
                        auVar87 = ZEXT416((uint)(local_484 * fVar162 * 4.0));
                        auVar88 = vfnmsub213ss_fma(ZEXT416((uint)local_484),ZEXT416((uint)local_484)
                                                   ,auVar87);
                        auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),
                                                  auVar87);
                        fVar162 = fVar162 * auVar91._0_4_ * 0.5;
                        fVar143 = auVar88._0_4_ * 0.5;
                        auVar192 = ZEXT464((uint)fVar143);
                        fVar153 = auVar87._0_4_ * 0.5;
                        fVar154 = local_484 * local_484 * 0.5;
                        auVar183._0_4_ = fVar154 * (float)local_4c0._0_4_;
                        auVar183._4_4_ = fVar154 * (float)local_4c0._4_4_;
                        auVar183._8_4_ = fVar154 * (float)uStack_4b8;
                        auVar183._12_4_ = fVar154 * uStack_4b8._4_4_;
                        auVar167._4_4_ = fVar153;
                        auVar167._0_4_ = fVar153;
                        auVar167._8_4_ = fVar153;
                        auVar167._12_4_ = fVar153;
                        auVar87 = vfmadd132ps_fma(auVar167,auVar183,local_4b0);
                        auVar184._4_4_ = fVar143;
                        auVar184._0_4_ = fVar143;
                        auVar184._8_4_ = fVar143;
                        auVar184._12_4_ = fVar143;
                        auVar87 = vfmadd132ps_fma(auVar184,auVar87,local_4a0);
                        auVar191 = ZEXT1664(auVar87);
                        auVar168._4_4_ = fVar162;
                        auVar168._0_4_ = fVar162;
                        auVar168._8_4_ = fVar162;
                        auVar168._12_4_ = fVar162;
                        auVar88 = vfmadd213ps_fma(auVar168,auVar196._0_16_,auVar87);
                        local_490 = vmovlps_avx(auVar88);
                        local_488 = vextractps_avx(auVar88,2);
                        local_47c = uVar80;
                        local_478 = (int)local_538;
                        local_474 = (local_508.context)->instID[0];
                        local_470 = (local_508.context)->instPrimID[0];
                        local_544 = -1;
                        local_508.valid = &local_544;
                        local_508.geometryUserPtr = pGVar76->userPtr;
                        local_508.ray = (RTCRayN *)ray;
                        local_508.hit = (RTCHitN *)&local_490;
                        local_508.N = 1;
                        if (pGVar76->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01cb66a4:
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar76->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar191 = ZEXT1664(auVar191._0_16_);
                            auVar192 = ZEXT1664(auVar192._0_16_);
                            (*p_Var13)(&local_508);
                            auVar199 = ZEXT3264(local_440);
                            auVar196 = ZEXT1664(local_4d0);
                            ray = local_530;
                            pGVar76 = local_540;
                            context = local_528;
                            if (*local_508.valid == 0) goto LAB_01cb6747;
                          }
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).components[0] =
                               *(float *)local_508.hit;
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_508.hit + 4);
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_508.hit + 8);
                          *(float *)((long)local_508.ray + 0x3c) = *(float *)(local_508.hit + 0xc);
                          *(float *)((long)local_508.ray + 0x40) = *(float *)(local_508.hit + 0x10);
                          *(float *)((long)local_508.ray + 0x44) = *(float *)(local_508.hit + 0x14);
                          *(float *)((long)local_508.ray + 0x48) = *(float *)(local_508.hit + 0x18);
                          *(float *)((long)local_508.ray + 0x4c) = *(float *)(local_508.hit + 0x1c);
                          *(float *)((long)local_508.ray + 0x50) = *(float *)(local_508.hit + 0x20);
                        }
                        else {
                          auVar191 = ZEXT1664(auVar87);
                          auVar192 = ZEXT464((uint)fVar143);
                          (*pGVar76->intersectionFilterN)(&local_508);
                          auVar199 = ZEXT3264(local_440);
                          auVar196 = ZEXT1664(local_4d0);
                          ray = local_530;
                          pGVar76 = local_540;
                          context = local_528;
                          if (*local_508.valid != 0) goto LAB_01cb66a4;
LAB_01cb6747:
                          (local_530->super_RayK<1>).tfar = (float)local_420._0_4_;
                          ray = local_530;
                          pGVar76 = local_540;
                          context = local_528;
                        }
                        bVar83 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar82;
                        fVar162 = (ray->super_RayK<1>).tfar;
                        auVar35._4_4_ = fVar162;
                        auVar35._0_4_ = fVar162;
                        auVar35._8_4_ = fVar162;
                        auVar35._12_4_ = fVar162;
                        auVar35._16_4_ = fVar162;
                        auVar35._20_4_ = fVar162;
                        auVar35._24_4_ = fVar162;
                        auVar35._28_4_ = fVar162;
                        uVar156 = vcmpps_avx512vl(auVar199._0_32_,auVar35,2);
                        if ((bVar83 & (byte)uVar156) == 0) goto LAB_01cb67e5;
                        local_420 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar83 = bVar83 & (byte)uVar156;
                        uVar82 = (uint)bVar83;
                        auVar151._8_4_ = 0x7f800000;
                        auVar151._0_8_ = 0x7f8000007f800000;
                        auVar151._12_4_ = 0x7f800000;
                        auVar151._16_4_ = 0x7f800000;
                        auVar151._20_4_ = 0x7f800000;
                        auVar151._24_4_ = 0x7f800000;
                        auVar151._28_4_ = 0x7f800000;
                        auVar98 = vblendmps_avx512vl(auVar151,auVar199._0_32_);
                        auVar133._0_4_ =
                             (uint)(bVar83 & 1) * auVar98._0_4_ |
                             (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar83 >> 1 & 1);
                        auVar133._4_4_ = (uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar83 >> 2 & 1);
                        auVar133._8_4_ = (uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar83 >> 3 & 1);
                        auVar133._12_4_ = (uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar83 >> 4 & 1);
                        auVar133._16_4_ = (uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar83 >> 5 & 1);
                        auVar133._20_4_ = (uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar83 >> 6 & 1);
                        auVar133._24_4_ = (uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        auVar133._28_4_ =
                             (uint)(bVar83 >> 7) * auVar98._28_4_ |
                             (uint)!(bool)(bVar83 >> 7) * 0x7f800000;
                        auVar98 = vshufps_avx(auVar133,auVar133,0xb1);
                        auVar98 = vminps_avx(auVar133,auVar98);
                        auVar96 = vshufpd_avx(auVar98,auVar98,5);
                        auVar98 = vminps_avx(auVar98,auVar96);
                        auVar96 = vpermpd_avx2(auVar98,0x4e);
                        auVar98 = vminps_avx(auVar98,auVar96);
                        uVar156 = vcmpps_avx512vl(auVar133,auVar98,0);
                        bVar71 = (byte)uVar156 & bVar83;
                        if (bVar71 != 0) {
                          bVar83 = bVar71;
                        }
                        uVar74 = 0;
                        for (uVar73 = (uint)bVar83; (uVar73 & 1) == 0;
                            uVar73 = uVar73 >> 1 | 0x80000000) {
                          uVar74 = uVar74 + 1;
                        }
                        uVar72 = (ulong)uVar74;
                      } while( true );
                    }
                    fVar162 = local_1e0[uVar72];
                    fVar143 = *(float *)(local_1c0 + uVar72 * 4);
                    fVar153 = 1.0 - fVar162;
                    auVar23._8_4_ = 0x80000000;
                    auVar23._0_8_ = 0x8000000080000000;
                    auVar23._12_4_ = 0x80000000;
                    auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar153),auVar23);
                    auVar87 = ZEXT416((uint)(fVar162 * fVar153 * 4.0));
                    auVar88 = vfnmsub213ss_fma(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),auVar87
                                              );
                    auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),auVar87)
                    ;
                    fVar153 = fVar153 * auVar91._0_4_ * 0.5;
                    fVar154 = auVar88._0_4_ * 0.5;
                    auVar192 = ZEXT464((uint)fVar154);
                    fVar155 = auVar87._0_4_ * 0.5;
                    fVar174 = fVar162 * fVar162 * 0.5;
                    auVar181._0_4_ = fVar174 * (float)local_4c0._0_4_;
                    auVar181._4_4_ = fVar174 * (float)local_4c0._4_4_;
                    auVar181._8_4_ = fVar174 * (float)uStack_4b8;
                    auVar181._12_4_ = fVar174 * uStack_4b8._4_4_;
                    auVar165._4_4_ = fVar155;
                    auVar165._0_4_ = fVar155;
                    auVar165._8_4_ = fVar155;
                    auVar165._12_4_ = fVar155;
                    auVar87 = vfmadd132ps_fma(auVar165,auVar181,local_4b0);
                    auVar182._4_4_ = fVar154;
                    auVar182._0_4_ = fVar154;
                    auVar182._8_4_ = fVar154;
                    auVar182._12_4_ = fVar154;
                    auVar87 = vfmadd132ps_fma(auVar182,auVar87,local_4a0);
                    auVar191 = ZEXT1664(auVar87);
                    auVar166._4_4_ = fVar153;
                    auVar166._0_4_ = fVar153;
                    auVar166._8_4_ = fVar153;
                    auVar166._12_4_ = fVar153;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar72 * 4);
                    auVar87 = vfmadd213ps_fma(auVar166,local_4d0,auVar87);
                    uVar156 = vmovlps_avx(auVar87);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar156;
                    fVar153 = (float)vextractps_avx(auVar87,2);
                    (ray->Ng).field_0.field_0.z = fVar153;
                    ray->u = fVar162;
                    ray->v = fVar143;
                    ray->primID = uVar80;
                    ray->geomID = (uint)local_538;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01cb64ef;
      }
LAB_01cb5bd3:
      fVar162 = (ray->super_RayK<1>).tfar;
      auVar30._4_4_ = fVar162;
      auVar30._0_4_ = fVar162;
      auVar30._8_4_ = fVar162;
      auVar30._12_4_ = fVar162;
      auVar30._16_4_ = fVar162;
      auVar30._20_4_ = fVar162;
      auVar30._24_4_ = fVar162;
      auVar30._28_4_ = fVar162;
      uVar156 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar80 = (uint)uVar81 & (uint)uVar156;
      uVar81 = (ulong)uVar80;
    } while (uVar80 != 0);
  }
  return;
LAB_01cb67e5:
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar212 = ZEXT3264(auVar98);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar213 = ZEXT1664(auVar87);
  auVar214 = ZEXT464(0x35000000);
  auVar98 = vmovdqa64_avx512vl(local_120);
  auVar211 = ZEXT3264(auVar98);
  prim = local_510;
  pre = local_518;
  pPVar79 = local_520;
  iVar77 = local_4d4;
LAB_01cb64ef:
  lVar75 = lVar75 + 8;
  if (iVar77 <= (int)lVar75) goto LAB_01cb5bd3;
  goto LAB_01cb5c64;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }